

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_initStats_ultra
               (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  ZSTD_match_t *pZVar2;
  ZSTD_optimal_t *pZVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  U32 UVar11;
  U32 UVar12;
  U32 UVar13;
  int iVar14;
  undefined1 (*iend) [16];
  long lVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  uint *puVar18;
  uint *puVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ZSTD_optimal_t *pZVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  BYTE *base;
  uint uVar27;
  uint uVar28;
  BYTE *base_1;
  undefined1 (*pauVar29) [16];
  uint uVar30;
  uint uVar31;
  uint uVar32;
  U32 *pUVar33;
  BYTE *pBVar34;
  optState_t *poVar35;
  undefined1 (*pauVar36) [16];
  ZSTD_optimal_t *pZVar37;
  ulong uVar38;
  undefined1 (*pauVar39) [16];
  uint uVar40;
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  BYTE *pBVar48;
  uint uVar49;
  ZSTD_optimal_t *pZVar50;
  ZSTD_optimal_t *pZVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  repcodes_t rVar65;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 tmpRep [3];
  U32 nextToUpdate3;
  uint *local_258;
  ulong local_250;
  ZSTD_optimal_t *local_240;
  ZSTD_optimal_t *local_238;
  ulong local_230;
  ZSTD_optimal_t *local_218;
  uint *local_200;
  uint *local_1f0;
  uint local_1d4;
  ZSTD_optimal_t *local_1d0;
  uint *local_1c8;
  ulong local_1c0;
  ZSTD_optimal_t *local_1b8;
  ZSTD_optimal_t *local_1b0;
  uint *local_1a8;
  undefined1 (*local_1a0) [16];
  undefined1 (*local_198) [16];
  ulong local_190;
  uint *local_188;
  uint local_17c;
  uint local_178;
  int local_174;
  U32 *local_170;
  BYTE *local_168;
  uint *local_160;
  uint *local_158;
  U32 *local_150;
  undefined1 (*local_148) [16];
  U32 local_140 [3];
  ZSTD_optimal_t *local_130;
  optState_t *local_128;
  U32 *local_120;
  seqStore_t *local_118;
  uint local_10c;
  U32 local_108;
  int local_104;
  size_t local_100;
  undefined1 (*local_f8) [16];
  ulong local_f0;
  undefined8 local_e8;
  U32 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ZSTD_optimal_t *local_c8;
  U32 *local_c0;
  U32 *local_b8;
  undefined1 (*local_b0) [16];
  ulong local_a8;
  ZSTD_optimal_t *local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  auVar54 = in_ZMM1._0_32_;
  local_140 = *(U32 (*) [3])rep;
  if ((ms->opt).litLengthSum != 0) {
    __assert_fail("ms->opt.litLengthSum == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a07,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (seqStore->sequences != seqStore->sequencesStart) {
    __assert_fail("seqStore->sequences == seqStore->sequencesStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a08,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar31 = (ms->window).dictLimit;
  if (uVar31 != (ms->window).lowLimit) {
    __assert_fail("ms->window.dictLimit == ms->window.lowLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a09,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  local_108 = ms->nextToUpdate;
  if (1 < uVar31 - local_108) {
    __assert_fail("ms->window.dictLimit - ms->nextToUpdate <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a0a,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  local_128 = &ms->opt;
  pBVar34 = (ms->window).base;
  local_10c = (ms->cParams).targetLength;
  if (0xffe < local_10c) {
    local_10c = 0xfff;
  }
  pauVar29 = (undefined1 (*) [16])((long)src + (srcSize - 8));
  local_190 = CONCAT71(local_190._1_7_,(ms->cParams).minMatch != 3);
  pZVar2 = (ms->opt).matchTable;
  pZVar3 = (ms->opt).priceTable;
  local_100 = srcSize;
  ZSTD_rescaleFreqs(local_128,(BYTE *)src,srcSize,2);
  auVar64 = in_ZMM5._0_32_;
  pauVar36 = (undefined1 (*) [16])((ulong)(pBVar34 + uVar31 == (BYTE *)src) + (long)src);
  local_f8 = pauVar29;
  if (pauVar29 <= pauVar36) {
LAB_0015af12:
    seqStore->lit = seqStore->litStart;
    seqStore->sequences = seqStore->sequencesStart;
    seqStore->longLengthID = 0;
    ppBVar1 = &(ms->window).base;
    *ppBVar1 = *ppBVar1 + -local_100;
    UVar12 = (int)local_100 + (ms->window).dictLimit;
    (ms->window).dictLimit = UVar12;
    (ms->window).lowLimit = UVar12;
    ms->nextToUpdate = UVar12;
    if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
      puVar19 = local_128->litFreq;
      auVar56 = ZEXT1664((undefined1  [16])0x0);
      lVar15 = 0;
      auVar54 = vpcmpeqd_avx2(auVar54,auVar54);
      do {
        auVar57 = vpslld_avx2(*(undefined1 (*) [32])(puVar19 + lVar15),4);
        auVar57 = vpaddd_avx2(auVar57,auVar54);
        *(undefined1 (*) [32])(puVar19 + lVar15) = auVar57;
        auVar57 = vpaddd_avx2(auVar57,auVar56._0_32_);
        auVar56 = ZEXT3264(auVar57);
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x100);
      auVar60 = vphaddd_avx(auVar57._16_16_,auVar57._0_16_);
      auVar60 = vphaddd_avx(auVar60,auVar60);
      auVar60 = vphaddd_avx(auVar60,auVar60);
      (ms->opt).litSum = auVar60._0_4_;
    }
    puVar19 = (ms->opt).litLengthFreq;
    auVar56 = ZEXT1664((undefined1  [16])0x0);
    lVar15 = 0;
    auVar57 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar55._8_8_ = 0x8000000000000000;
    auVar55._0_8_ = 0x8000000000000000;
    auVar55._16_8_ = 0x8000000000000000;
    auVar55._24_8_ = 0x8000000000000000;
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar58._8_8_ = 0x8000000000000024;
    auVar58._0_8_ = 0x8000000000000024;
    auVar58._16_8_ = 0x8000000000000024;
    auVar58._24_8_ = 0x8000000000000024;
    auVar54 = vpcmpeqd_avx2(auVar64,auVar64);
    do {
      auVar62._8_8_ = lVar15;
      auVar62._0_8_ = lVar15;
      auVar62._16_8_ = lVar15;
      auVar62._24_8_ = lVar15;
      auVar59 = vpor_avx2(auVar62,auVar57);
      auVar64 = vpor_avx2(auVar62,auVar6);
      auVar64 = vpcmpgtq_avx2(auVar58,auVar64 ^ auVar55);
      auVar59 = vpcmpgtq_avx2(auVar58,auVar59 ^ auVar55);
      auVar59 = vpackssdw_avx2(auVar59,auVar64);
      auVar60 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
      auVar60 = vpshufd_avx(auVar60,0xd8);
      auVar64 = vpmovzxwd_avx2(auVar60);
      auVar63 = vpslld_avx2(auVar64,0x1f);
      auVar64 = vpmaskmovd_avx2(auVar63,*(undefined1 (*) [32])(puVar19 + lVar15));
      auVar64 = vpslld_avx2(auVar64,4);
      auVar62 = vpaddd_avx2(auVar64,auVar54);
      auVar64 = vpmaskmovd_avx2(auVar63,auVar62);
      *(undefined1 (*) [32])(puVar19 + lVar15) = auVar64;
      auVar63 = auVar56._0_32_;
      auVar64 = vpaddd_avx2(auVar62,auVar63);
      auVar56 = ZEXT3264(auVar64);
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x28);
    auVar58 = vpermq_avx2(auVar59,0xd8);
    auVar64 = vblendvps_avx(auVar63,auVar64,auVar58);
    auVar60 = vphaddd_avx(auVar64._16_16_,auVar64._0_16_);
    auVar60 = vphaddd_avx(auVar60,auVar60);
    auVar60 = vphaddd_avx(auVar60,auVar60);
    (ms->opt).litLengthSum = auVar60._0_4_;
    puVar19 = (ms->opt).matchLengthFreq;
    auVar56 = ZEXT1664((undefined1  [16])0x0);
    lVar15 = 0;
    auVar59._8_8_ = 0x8000000000000035;
    auVar59._0_8_ = 0x8000000000000035;
    auVar59._16_8_ = 0x8000000000000035;
    auVar59._24_8_ = 0x8000000000000035;
    auVar54 = vpcmpeqd_avx2(auVar54,auVar54);
    do {
      auVar63._8_8_ = lVar15;
      auVar63._0_8_ = lVar15;
      auVar63._16_8_ = lVar15;
      auVar63._24_8_ = lVar15;
      auVar58 = vpor_avx2(auVar63,auVar57);
      auVar64 = vpor_avx2(auVar63,auVar6);
      auVar64 = vpcmpgtq_avx2(auVar59,auVar64 ^ auVar55);
      auVar58 = vpcmpgtq_avx2(auVar59,auVar58 ^ auVar55);
      auVar58 = vpackssdw_avx2(auVar58,auVar64);
      auVar60 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
      auVar60 = vpshufd_avx(auVar60,0xd8);
      auVar64 = vpmovzxwd_avx2(auVar60);
      auVar63 = vpslld_avx2(auVar64,0x1f);
      auVar64 = vpmaskmovd_avx2(auVar63,*(undefined1 (*) [32])(puVar19 + lVar15));
      auVar64 = vpslld_avx2(auVar64,4);
      auVar62 = vpaddd_avx2(auVar64,auVar54);
      auVar64 = vpmaskmovd_avx2(auVar63,auVar62);
      *(undefined1 (*) [32])(puVar19 + lVar15) = auVar64;
      auVar63 = auVar56._0_32_;
      auVar64 = vpaddd_avx2(auVar62,auVar63);
      auVar56 = ZEXT3264(auVar64);
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x38);
    auVar54 = vpermq_avx2(auVar58,0xd8);
    auVar54 = vblendvps_avx(auVar63,auVar64,auVar54);
    auVar53 = auVar54._16_16_;
    auVar60 = vphaddd_avx(auVar53,auVar54._0_16_);
    auVar60 = vphaddd_avx(auVar60,auVar60);
    auVar60 = vphaddd_avx(auVar60,auVar60);
    (ms->opt).matchLengthSum = auVar60._0_4_;
    puVar19 = (ms->opt).offCodeFreq;
    auVar56 = ZEXT1664((undefined1  [16])0x0);
    lVar15 = 0;
    auVar54 = vpcmpeqd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar53));
    do {
      auVar64 = vpslld_avx2(*(undefined1 (*) [32])(puVar19 + lVar15),4);
      auVar64 = vpaddd_avx2(auVar64,auVar54);
      *(undefined1 (*) [32])(puVar19 + lVar15) = auVar64;
      auVar64 = vpaddd_avx2(auVar64,auVar56._0_32_);
      auVar56 = ZEXT3264(auVar64);
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x20);
    auVar60 = vphaddd_avx(auVar64._16_16_,auVar64._0_16_);
    auVar60 = vphaddd_avx(auVar60,auVar60);
    auVar60 = vphaddd_avx(auVar60,auVar60);
    (ms->opt).offCodeSum = auVar60._0_4_;
    return;
  }
  iend = (undefined1 (*) [16])(local_100 + (long)src);
  uVar31 = (uint)(byte)local_190;
  local_130 = (ZSTD_optimal_t *)(ulong)(uVar31 + 2);
  pauVar29 = (undefined1 (*) [16])(iend[-1] + 9);
  local_198 = (undefined1 (*) [16])(iend[-1] + 0xd);
  local_1a0 = (undefined1 (*) [16])(iend[-1] + 0xf);
  local_c0 = pZVar3->rep;
  local_b0 = iend + -2;
  local_f0 = (ulong)(uVar31 + 3);
  local_a8 = (ulong)(uVar31 + 9 & 0xfffffff8);
  lVar15 = (ulong)(uVar31 + 3) - 2;
  local_98._8_8_ = lVar15;
  local_98._0_8_ = lVar15;
  local_98._16_8_ = lVar15;
  local_98._24_8_ = lVar15;
  local_c8 = pZVar3 + 8;
  local_a0 = pZVar3 + 1;
  local_d8 = 0x8000000000000000;
  uStack_d0 = 0x8000000000000000;
  local_58._8_8_ = 0x8000000000000000;
  local_58._0_8_ = 0x8000000000000000;
  local_58._16_8_ = 0x8000000000000000;
  local_58._24_8_ = 0x8000000000000000;
  auVar56 = ZEXT3264(local_58);
  local_78 = local_98 ^ local_58;
  local_118 = seqStore;
  local_148 = (undefined1 (*) [16])src;
LAB_00156dd4:
  pBVar34 = (ms->window).base;
  uVar16 = (ulong)ms->nextToUpdate;
  if ((undefined1 (*) [16])(pBVar34 + uVar16) <= pauVar36) {
    iVar20 = (int)pauVar36;
    local_190 = (ulong)(uint)(iVar20 - (int)local_148);
    UVar12 = (ms->cParams).minMatch;
    while( true ) {
      uVar31 = (uint)uVar16;
      uVar24 = (uint)((long)pauVar36 - (long)pBVar34);
      if (uVar24 <= uVar31) break;
      auVar56 = ZEXT1664(auVar56._0_16_);
      in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
      UVar11 = ZSTD_insertBt1(ms,pBVar34 + uVar16,(BYTE *)iend,UVar12,0);
      uVar16 = (ulong)(UVar11 + uVar31);
      if (UVar11 + uVar31 <= uVar31) {
LAB_0015b1d7:
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4786,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)pauVar36 - (long)pBVar34) >> 0x20 != 0) {
LAB_0015b401:
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4789,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iend - (long)pBVar34) >> 0x20 != 0) {
LAB_0015b3df:
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x478a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar24;
    if (UVar12 - 6 < 2) {
      uVar16 = (ulong)((int)local_190 == 0);
      uVar31 = (ms->cParams).targetLength;
      if (0xffe < uVar31) {
        uVar31 = 0xfff;
      }
      local_1d0 = (ZSTD_optimal_t *)CONCAT44(local_1d0._4_4_,uVar31);
      pBVar34 = (ms->window).base;
      uVar40 = iVar20 - (int)pBVar34;
      local_1b0 = (ZSTD_optimal_t *)
                  ((ulong)(*(long *)*pauVar36 * -0x30e4432340650000) >>
                  (-(char)(ms->cParams).hashLog & 0x3fU));
      local_170 = ms->chainTable;
      uVar46 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar24 = uVar40 - uVar46;
      local_250 = 0;
      if (uVar40 < uVar46) {
        uVar24 = 0;
      }
      uVar27 = (ms->window).dictLimit;
      uVar26 = (ulong)uVar27;
      uVar28 = (ms->window).lowLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = uVar40 - uVar30;
      if (uVar40 - uVar28 <= uVar30) {
        uVar32 = uVar28;
      }
      if (ms->loadedDictEnd != 0) {
        uVar32 = uVar28;
      }
      uVar22 = uVar32 + (uVar32 == 0);
      local_188 = (uint *)CONCAT44(local_188._4_4_,uVar22);
      uVar42 = (ulong)((uVar46 & uVar40) * 2);
      local_200 = local_170 + uVar42;
      puVar19 = local_170 + uVar42 + 1;
      pUVar33 = ms->hashTable;
      uVar30 = pUVar33[(long)local_1b0];
      local_1b8 = (ZSTD_optimal_t *)CONCAT44(local_1b8._4_4_,uVar40 + 8);
      uVar47 = uVar40 + 9;
      uVar28 = (ms->cParams).searchLog;
      uVar42 = uVar16 + 3;
      pauVar39 = (undefined1 (*) [16])(*pauVar36 + 4);
      pZVar23 = local_130;
      do {
        uVar49 = local_140[0] - 1;
        if (uVar16 != 3) {
          uVar49 = local_140[uVar16];
        }
        local_1c0 = uVar26;
        if (uVar40 < uVar27) goto LAB_0015b1f6;
        if (uVar49 - 1 < uVar40 - uVar27) {
          if (*(int *)*pauVar36 != *(int *)((long)pauVar36 - (ulong)uVar49)) goto LAB_0015743a;
          lVar15 = -(ulong)uVar49;
          puVar25 = (ulong *)((long)pauVar39 + lVar15);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = lVar15 + 0xc;
              lVar43 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])(*pauVar36 + lVar43 + 0xc);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)((long)pauVar36 + lVar43 + lVar15);
                  goto LAB_00157457;
                }
                uVar38 = *(ulong *)((long)pauVar36 + lVar43 + lVar15);
                lVar43 = lVar43 + 8;
              } while (uVar38 == *(ulong *)*pauVar17);
              uVar38 = *(ulong *)*pauVar17 ^ uVar38;
              uVar44 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar49 = ((uint)(uVar44 >> 3) & 0x1fffffff) + (int)lVar43;
            }
            else {
              uVar44 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar38 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar49 = (uint)(uVar38 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_00157457:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar49 = (int)pauVar17 - (int)pauVar39;
          }
          pZVar37 = (ZSTD_optimal_t *)(ulong)(uVar49 + 4);
        }
        else {
          if (uVar40 < uVar32) goto LAB_0015b218;
LAB_0015743a:
          pZVar37 = (ZSTD_optimal_t *)0x0;
        }
        if (pZVar23 < pZVar37) {
          pZVar2[local_250].off = (int)uVar16 - (uint)((int)local_190 == 0);
          pZVar2[local_250].len = (uint)pZVar37;
          local_250 = (ulong)((int)local_250 + 1);
          if ((uVar31 < (uint)pZVar37) ||
             (pZVar23 = pZVar37,
             (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar36 + -0x10) == iend))
          goto LAB_001585e2;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar42);
      pUVar33[(long)local_1b0] = uVar40;
      if (uVar22 <= uVar30) {
        uVar31 = ~(-1 << ((byte)uVar28 & 0x1f));
        local_1c8 = (uint *)(*pauVar36 + 8);
        pZVar37 = (ZSTD_optimal_t *)0x0;
        pZVar50 = (ZSTD_optimal_t *)0x0;
        do {
          pZVar51 = pZVar50;
          if (pZVar37 < pZVar50) {
            pZVar51 = pZVar37;
          }
          local_1b0 = pZVar50;
          if (uVar40 <= uVar30) goto LAB_0015b2db;
          local_1d0 = (ZSTD_optimal_t *)CONCAT44(local_1d0._4_4_,uVar31);
          uVar16 = (long)pZVar51->rep + ((ulong)uVar30 - 0x10);
          if (uVar16 < uVar26) goto LAB_0015b2b9;
          pBVar48 = pBVar34 + uVar30;
          if ((uint)uVar26 <= uVar30) {
            auVar56 = ZEXT1664(auVar56._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            iVar20 = bcmp(pBVar48,pauVar36,(size_t)pZVar51);
            uVar26 = local_1c0;
            if (iVar20 != 0) goto LAB_0015b33e;
          }
          pauVar39 = (undefined1 (*) [16])((long)pZVar51->rep + (long)*pauVar36 + -0x10);
          puVar25 = (ulong *)(pBVar48 + (long)pZVar51);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])
                           ((undefined1 *)((long)local_1c8 + (long)pZVar51) + lVar15);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)(pBVar34 + uVar16 + lVar15 + 8);
                  goto LAB_0015767a;
                }
                lVar43 = lVar15 + uVar16 + 8;
                lVar15 = lVar15 + 8;
              } while (*(ulong *)(pBVar34 + lVar43) == *(ulong *)*pauVar17);
              uVar42 = *(ulong *)*pauVar17 ^ *(ulong *)(pBVar34 + lVar43);
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
            }
            else {
              uVar42 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = uVar16 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0015767a:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar16 = (long)pauVar17 - (long)pauVar39;
          }
          pUVar33 = pZVar51->rep;
          pZVar50 = (ZSTD_optimal_t *)((long)pUVar33 + (uVar16 - 0x10));
          if (pZVar23 < pZVar50) {
            if (uVar47 < uVar30 || uVar47 - uVar30 == 0) goto LAB_0015b35d;
            if ((ZSTD_optimal_t *)(ulong)(uVar47 - uVar30) < pZVar50) {
              uVar47 = uVar30 + (U32)pZVar50;
            }
            pZVar2[local_250].off = (uVar40 + 2) - uVar30;
            pZVar2[local_250].len = (U32)pZVar50;
            local_250 = (ulong)((int)local_250 + 1);
            if (((ZSTD_optimal_t *)0x1000 < pZVar50) ||
               (pZVar23 = pZVar50,
               (undefined1 (*) [16])(pauVar36[-1] + (long)pUVar33 + uVar16) == iend)) break;
          }
          puVar18 = local_170 + (uVar30 & uVar46) * 2;
          if (pBVar48[(long)pZVar50] < (byte)pauVar36[-1][(long)pUVar33 + uVar16]) {
            *local_200 = uVar30;
            if (uVar30 <= uVar24) goto LAB_001585ab;
            puVar18 = puVar18 + 1;
            pZVar37 = pZVar50;
            pZVar50 = local_1b0;
            local_200 = puVar18;
          }
          else {
            *puVar19 = uVar30;
            puVar19 = puVar18;
            if (uVar30 <= uVar24) goto LAB_001585a1;
          }
          uVar31 = (int)local_1d0 - 1;
          if ((int)local_1d0 == 0) break;
          uVar30 = *puVar18;
        } while ((uint)local_188 <= uVar30);
      }
      goto LAB_001585bb;
    }
    if (UVar12 == 5) {
      uVar16 = (ulong)((int)local_190 == 0);
      uVar31 = (ms->cParams).targetLength;
      if (0xffe < uVar31) {
        uVar31 = 0xfff;
      }
      local_1d0 = (ZSTD_optimal_t *)CONCAT44(local_1d0._4_4_,uVar31);
      pBVar34 = (ms->window).base;
      uVar40 = iVar20 - (int)pBVar34;
      local_1b0 = (ZSTD_optimal_t *)
                  ((ulong)(*(long *)*pauVar36 * -0x30e4432345000000) >>
                  (-(char)(ms->cParams).hashLog & 0x3fU));
      pUVar33 = ms->chainTable;
      uVar46 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar24 = uVar40 - uVar46;
      local_250 = 0;
      if (uVar40 < uVar46) {
        uVar24 = 0;
      }
      uVar27 = (ms->window).dictLimit;
      uVar26 = (ulong)uVar27;
      uVar28 = (ms->window).lowLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = uVar40 - uVar30;
      if (uVar40 - uVar28 <= uVar30) {
        uVar32 = uVar28;
      }
      if (ms->loadedDictEnd != 0) {
        uVar32 = uVar28;
      }
      uVar30 = uVar32 + (uVar32 == 0);
      local_188 = (uint *)CONCAT44(local_188._4_4_,uVar30);
      local_170 = (U32 *)CONCAT44(local_170._4_4_,uVar46);
      uVar42 = (ulong)((uVar46 & uVar40) * 2);
      local_200 = pUVar33 + uVar42;
      puVar19 = pUVar33 + uVar42 + 1;
      pUVar4 = ms->hashTable;
      uVar28 = pUVar4[(long)local_1b0];
      local_1b8 = (ZSTD_optimal_t *)CONCAT44(local_1b8._4_4_,uVar40 + 8);
      uVar47 = uVar40 + 9;
      uVar46 = (ms->cParams).searchLog;
      uVar42 = uVar16 + 3;
      pauVar39 = (undefined1 (*) [16])(*pauVar36 + 4);
      pZVar23 = local_130;
      do {
        uVar22 = local_140[0] - 1;
        if (uVar16 != 3) {
          uVar22 = local_140[uVar16];
        }
        local_1c0 = uVar26;
        if (uVar40 < uVar27) goto LAB_0015b1f6;
        if (uVar22 - 1 < uVar40 - uVar27) {
          if (*(int *)*pauVar36 != *(int *)((long)pauVar36 - (ulong)uVar22)) goto LAB_001579a6;
          lVar15 = -(ulong)uVar22;
          puVar25 = (ulong *)((long)pauVar39 + lVar15);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = lVar15 + 0xc;
              lVar43 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])(*pauVar36 + lVar43 + 0xc);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)((long)pauVar36 + lVar43 + lVar15);
                  goto LAB_001579c3;
                }
                uVar38 = *(ulong *)((long)pauVar36 + lVar43 + lVar15);
                lVar43 = lVar43 + 8;
              } while (uVar38 == *(ulong *)*pauVar17);
              uVar38 = *(ulong *)*pauVar17 ^ uVar38;
              uVar44 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar22 = ((uint)(uVar44 >> 3) & 0x1fffffff) + (int)lVar43;
            }
            else {
              uVar44 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar38 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar22 = (uint)(uVar38 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_001579c3:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar22 = (int)pauVar17 - (int)pauVar39;
          }
          pZVar37 = (ZSTD_optimal_t *)(ulong)(uVar22 + 4);
        }
        else {
          if (uVar40 < uVar32) goto LAB_0015b218;
LAB_001579a6:
          pZVar37 = (ZSTD_optimal_t *)0x0;
        }
        if (pZVar23 < pZVar37) {
          pZVar2[local_250].off = (int)uVar16 - (uint)((int)local_190 == 0);
          pZVar2[local_250].len = (uint)pZVar37;
          local_250 = (ulong)((int)local_250 + 1);
          if ((uVar31 < (uint)pZVar37) ||
             (pZVar23 = pZVar37,
             (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar36 + -0x10) == iend))
          goto LAB_001585e2;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar42);
      pUVar4[(long)local_1b0] = uVar40;
      if (uVar30 <= uVar28) {
        uVar31 = ~(-1 << ((byte)uVar46 & 0x1f));
        local_1c8 = (uint *)(*pauVar36 + 8);
        pZVar37 = (ZSTD_optimal_t *)0x0;
        pZVar50 = (ZSTD_optimal_t *)0x0;
        do {
          pZVar51 = pZVar50;
          if (pZVar37 < pZVar50) {
            pZVar51 = pZVar37;
          }
          local_1b0 = pZVar50;
          if (uVar40 <= uVar28) goto LAB_0015b2db;
          local_1d0 = (ZSTD_optimal_t *)CONCAT44(local_1d0._4_4_,uVar31);
          uVar16 = (long)pZVar51->rep + ((ulong)uVar28 - 0x10);
          if (uVar16 < uVar26) goto LAB_0015b2b9;
          pBVar48 = pBVar34 + uVar28;
          if ((uint)uVar26 <= uVar28) {
            auVar56 = ZEXT1664(auVar56._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            iVar20 = bcmp(pBVar48,pauVar36,(size_t)pZVar51);
            uVar26 = local_1c0;
            if (iVar20 != 0) goto LAB_0015b33e;
          }
          pauVar39 = (undefined1 (*) [16])((long)pZVar51->rep + (long)*pauVar36 + -0x10);
          puVar25 = (ulong *)(pBVar48 + (long)pZVar51);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])
                           ((undefined1 *)((long)local_1c8 + (long)pZVar51) + lVar15);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)(pBVar34 + uVar16 + lVar15 + 8);
                  goto LAB_00157f44;
                }
                lVar43 = lVar15 + uVar16 + 8;
                lVar15 = lVar15 + 8;
              } while (*(ulong *)(pBVar34 + lVar43) == *(ulong *)*pauVar17);
              uVar42 = *(ulong *)*pauVar17 ^ *(ulong *)(pBVar34 + lVar43);
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
            }
            else {
              uVar42 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = uVar16 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00157f44:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar16 = (long)pauVar17 - (long)pauVar39;
          }
          pUVar4 = pZVar51->rep;
          pZVar50 = (ZSTD_optimal_t *)((long)pUVar4 + (uVar16 - 0x10));
          if (pZVar23 < pZVar50) {
            if (uVar47 < uVar28 || uVar47 - uVar28 == 0) goto LAB_0015b35d;
            if ((ZSTD_optimal_t *)(ulong)(uVar47 - uVar28) < pZVar50) {
              uVar47 = uVar28 + (U32)pZVar50;
            }
            pZVar2[local_250].off = (uVar40 + 2) - uVar28;
            pZVar2[local_250].len = (U32)pZVar50;
            local_250 = (ulong)((int)local_250 + 1);
            if (((ZSTD_optimal_t *)0x1000 < pZVar50) ||
               (pZVar23 = pZVar50,
               (undefined1 (*) [16])(pauVar36[-1] + (long)pUVar4 + uVar16) == iend)) break;
          }
          puVar18 = pUVar33 + (uVar28 & (uint)local_170) * 2;
          if (pBVar48[(long)pZVar50] < (byte)pauVar36[-1][(long)pUVar4 + uVar16]) {
            *local_200 = uVar28;
            if (uVar28 <= uVar24) goto LAB_001585ab;
            puVar18 = puVar18 + 1;
            pZVar37 = pZVar50;
            pZVar50 = local_1b0;
            local_200 = puVar18;
          }
          else {
            *puVar19 = uVar28;
            puVar19 = puVar18;
            if (uVar28 <= uVar24) goto LAB_001585a1;
          }
          uVar31 = (int)local_1d0 - 1;
          if ((int)local_1d0 == 0) break;
          uVar28 = *puVar18;
        } while ((uint)local_188 <= uVar28);
      }
      goto LAB_001585bb;
    }
    if (UVar12 != 3) {
      uVar16 = (ulong)((int)local_190 == 0);
      uVar31 = (ms->cParams).targetLength;
      if (0xffe < uVar31) {
        uVar31 = 0xfff;
      }
      local_1d0 = (ZSTD_optimal_t *)CONCAT44(local_1d0._4_4_,uVar31);
      pBVar34 = (ms->window).base;
      uVar40 = iVar20 - (int)pBVar34;
      local_1b0 = (ZSTD_optimal_t *)
                  (ulong)((uint)(*(int *)*pauVar36 * -0x61c8864f) >>
                         (-(char)(ms->cParams).hashLog & 0x1fU));
      local_170 = ms->chainTable;
      uVar46 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar24 = uVar40 - uVar46;
      local_250 = 0;
      if (uVar40 < uVar46) {
        uVar24 = 0;
      }
      uVar27 = (ms->window).dictLimit;
      uVar26 = (ulong)uVar27;
      uVar28 = (ms->window).lowLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = uVar40 - uVar30;
      if (uVar40 - uVar28 <= uVar30) {
        uVar32 = uVar28;
      }
      if (ms->loadedDictEnd != 0) {
        uVar32 = uVar28;
      }
      uVar22 = uVar32 + (uVar32 == 0);
      local_188 = (uint *)CONCAT44(local_188._4_4_,uVar22);
      uVar42 = (ulong)((uVar46 & uVar40) * 2);
      local_200 = local_170 + uVar42;
      puVar19 = local_170 + uVar42 + 1;
      pUVar33 = ms->hashTable;
      uVar30 = pUVar33[(long)local_1b0];
      local_1b8 = (ZSTD_optimal_t *)CONCAT44(local_1b8._4_4_,uVar40 + 8);
      uVar47 = uVar40 + 9;
      uVar28 = (ms->cParams).searchLog;
      uVar42 = uVar16 + 3;
      pauVar39 = (undefined1 (*) [16])(*pauVar36 + 4);
      pZVar23 = local_130;
      do {
        uVar49 = local_140[0] - 1;
        if (uVar16 != 3) {
          uVar49 = local_140[uVar16];
        }
        local_1c0 = uVar26;
        if (uVar40 < uVar27) goto LAB_0015b1f6;
        if (uVar49 - 1 < uVar40 - uVar27) {
          if (*(int *)*pauVar36 != *(int *)((long)pauVar36 - (ulong)uVar49)) goto LAB_00157c83;
          lVar15 = -(ulong)uVar49;
          puVar25 = (ulong *)((long)pauVar39 + lVar15);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = lVar15 + 0xc;
              lVar43 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])(*pauVar36 + lVar43 + 0xc);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)((long)pauVar36 + lVar43 + lVar15);
                  goto LAB_00157ca0;
                }
                uVar38 = *(ulong *)((long)pauVar36 + lVar43 + lVar15);
                lVar43 = lVar43 + 8;
              } while (uVar38 == *(ulong *)*pauVar17);
              uVar38 = *(ulong *)*pauVar17 ^ uVar38;
              uVar44 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar49 = ((uint)(uVar44 >> 3) & 0x1fffffff) + (int)lVar43;
            }
            else {
              uVar44 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar38 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar49 = (uint)(uVar38 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_00157ca0:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar49 = (int)pauVar17 - (int)pauVar39;
          }
          pZVar37 = (ZSTD_optimal_t *)(ulong)(uVar49 + 4);
        }
        else {
          if (uVar40 < uVar32) goto LAB_0015b218;
LAB_00157c83:
          pZVar37 = (ZSTD_optimal_t *)0x0;
        }
        if (pZVar23 < pZVar37) {
          pZVar2[local_250].off = (int)uVar16 - (uint)((int)local_190 == 0);
          pZVar2[local_250].len = (uint)pZVar37;
          local_250 = (ulong)((int)local_250 + 1);
          if ((uVar31 < (uint)pZVar37) ||
             (pZVar23 = pZVar37,
             (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar36 + -0x10) == iend))
          goto LAB_001585e2;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar42);
      pUVar33[(long)local_1b0] = uVar40;
      if (uVar22 <= uVar30) {
        uVar31 = ~(-1 << ((byte)uVar28 & 0x1f));
        local_1c8 = (uint *)(*pauVar36 + 8);
        pZVar37 = (ZSTD_optimal_t *)0x0;
        pZVar50 = (ZSTD_optimal_t *)0x0;
        do {
          pZVar51 = pZVar50;
          if (pZVar37 < pZVar50) {
            pZVar51 = pZVar37;
          }
          local_1b0 = pZVar50;
          if (uVar40 <= uVar30) goto LAB_0015b2db;
          local_1d0 = (ZSTD_optimal_t *)CONCAT44(local_1d0._4_4_,uVar31);
          uVar16 = (long)pZVar51->rep + ((ulong)uVar30 - 0x10);
          if (uVar16 < uVar26) goto LAB_0015b2b9;
          pBVar48 = pBVar34 + uVar30;
          if ((uint)uVar26 <= uVar30) {
            auVar56 = ZEXT1664(auVar56._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            iVar20 = bcmp(pBVar48,pauVar36,(size_t)pZVar51);
            uVar26 = local_1c0;
            if (iVar20 != 0) goto LAB_0015b33e;
          }
          pauVar39 = (undefined1 (*) [16])((long)pZVar51->rep + (long)*pauVar36 + -0x10);
          puVar25 = (ulong *)(pBVar48 + (long)pZVar51);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])
                           ((undefined1 *)((long)local_1c8 + (long)pZVar51) + lVar15);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)(pBVar34 + uVar16 + lVar15 + 8);
                  goto LAB_001581d3;
                }
                lVar43 = lVar15 + uVar16 + 8;
                lVar15 = lVar15 + 8;
              } while (*(ulong *)(pBVar34 + lVar43) == *(ulong *)*pauVar17);
              uVar42 = *(ulong *)*pauVar17 ^ *(ulong *)(pBVar34 + lVar43);
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
            }
            else {
              uVar42 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = uVar16 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001581d3:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar16 = (long)pauVar17 - (long)pauVar39;
          }
          pUVar33 = pZVar51->rep;
          pZVar50 = (ZSTD_optimal_t *)((long)pUVar33 + (uVar16 - 0x10));
          if (pZVar23 < pZVar50) {
            if (uVar47 < uVar30 || uVar47 - uVar30 == 0) goto LAB_0015b35d;
            if ((ZSTD_optimal_t *)(ulong)(uVar47 - uVar30) < pZVar50) {
              uVar47 = uVar30 + (U32)pZVar50;
            }
            pZVar2[local_250].off = (uVar40 + 2) - uVar30;
            pZVar2[local_250].len = (U32)pZVar50;
            local_250 = (ulong)((int)local_250 + 1);
            if (((ZSTD_optimal_t *)0x1000 < pZVar50) ||
               (pZVar23 = pZVar50,
               (undefined1 (*) [16])(pauVar36[-1] + (long)pUVar33 + uVar16) == iend)) break;
          }
          puVar18 = local_170 + (uVar30 & uVar46) * 2;
          if (pBVar48[(long)pZVar50] < (byte)pauVar36[-1][(long)pUVar33 + uVar16]) {
            *local_200 = uVar30;
            if (uVar30 <= uVar24) goto LAB_001585ab;
            puVar18 = puVar18 + 1;
            pZVar37 = pZVar50;
            pZVar50 = local_1b0;
            local_200 = puVar18;
          }
          else {
            *puVar19 = uVar30;
            puVar19 = puVar18;
            if (uVar30 <= uVar24) goto LAB_001585a1;
          }
          uVar31 = (int)local_1d0 - 1;
          if ((int)local_1d0 == 0) break;
          uVar30 = *puVar18;
        } while ((uint)local_188 <= uVar30);
      }
      goto LAB_001585bb;
    }
    uVar16 = (ulong)((int)local_190 == 0);
    uVar31 = (ms->cParams).targetLength;
    if (0xffe < uVar31) {
      uVar31 = 0xfff;
    }
    pBVar34 = (ms->window).base;
    uVar40 = iVar20 - (int)pBVar34;
    local_1c0 = (ulong)uVar40;
    uVar26 = (ulong)((uint)(*(int *)*pauVar36 * -0x61c8864f) >>
                    (-(char)(ms->cParams).hashLog & 0x1fU));
    local_170 = ms->chainTable;
    uVar46 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar24 = uVar40 - uVar46;
    local_250 = 0;
    if (uVar40 < uVar46) {
      uVar24 = 0;
    }
    uVar27 = (ms->window).dictLimit;
    uVar28 = (ms->window).lowLimit;
    uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar32 = uVar40 - uVar30;
    if (uVar40 - uVar28 <= uVar30) {
      uVar32 = uVar28;
    }
    if (ms->loadedDictEnd != 0) {
      uVar32 = uVar28;
    }
    local_1b0 = (ZSTD_optimal_t *)CONCAT44(local_1b0._4_4_,uVar32 + (uVar32 == 0));
    uVar42 = (ulong)((uVar46 & uVar40) * 2);
    local_188 = local_170 + uVar42;
    puVar19 = local_170 + uVar42 + 1;
    local_1d0 = (ZSTD_optimal_t *)-uVar16;
    local_1b8 = (ZSTD_optimal_t *)ms->hashTable;
    uVar28 = local_1b8->rep[uVar26 - 4];
    local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,uVar40 + 8);
    uVar30 = uVar40 + 9;
    local_1a8 = (uint *)CONCAT44(local_1a8._4_4_,(ms->cParams).searchLog);
    uVar42 = uVar16 + 3;
    pauVar39 = (undefined1 (*) [16])(*pauVar36 + 3);
    pZVar23 = local_130;
    do {
      UVar12 = local_140[0] - 1;
      if (uVar16 != 3) {
        UVar12 = local_140[uVar16];
      }
      if (uVar40 < uVar27) {
LAB_0015b1f6:
        __assert_fail("current >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x47d0,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (UVar12 - 1 < uVar40 - uVar27) {
        if (((*(uint *)((long)pauVar36 - (ulong)UVar12) ^ *(uint *)*pauVar36) & 0xffffff) == 0) {
          lVar15 = -(ulong)UVar12;
          puVar25 = (ulong *)((long)pauVar39 + lVar15);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = lVar15 + 0xb;
              lVar43 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])(*pauVar36 + lVar43 + 0xb);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)((long)pauVar36 + lVar43 + lVar15);
                  goto LAB_001570c0;
                }
                uVar38 = *(ulong *)((long)pauVar36 + lVar43 + lVar15);
                lVar43 = lVar43 + 8;
              } while (uVar38 == *(ulong *)*pauVar17);
              uVar38 = *(ulong *)*pauVar17 ^ uVar38;
              uVar44 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar47 = ((uint)(uVar44 >> 3) & 0x1fffffff) + (int)lVar43;
            }
            else {
              uVar44 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar38 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar47 = (uint)(uVar38 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_001570c0:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar47 = (int)pauVar17 - (int)pauVar39;
          }
          uVar47 = uVar47 + 3;
        }
        else {
          uVar47 = 0;
        }
      }
      else {
        if (uVar40 < uVar32) {
LAB_0015b218:
          __assert_fail("current >= windowLow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x47d9,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar47 = 0;
      }
      pZVar37 = (ZSTD_optimal_t *)(ulong)uVar47;
      if (pZVar23 < pZVar37) {
        pZVar2[local_250].off = (int)uVar16 + (int)local_1d0;
        pZVar2[local_250].len = uVar47;
        local_250 = (ulong)((int)local_250 + 1);
        if ((uVar31 < uVar47) ||
           (pZVar23 = pZVar37,
           (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar36 + -0x10) == iend))
        goto LAB_001585e2;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar42);
    if (pZVar23 < (ZSTD_optimal_t *)0x3) {
      auVar56 = ZEXT1664(auVar56._0_16_);
      in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
      UVar12 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_108,(BYTE *)pauVar36);
      if (UVar12 < (uint)local_1b0) goto LAB_00157d8b;
      uVar40 = (uint)local_1c0;
      if (0x3ffff < uVar40 - UVar12) goto LAB_00157d8b;
      uVar16 = (ulong)UVar12;
      puVar25 = (ulong *)(pBVar34 + uVar16);
      pauVar39 = pauVar36;
      if (pauVar36 < pauVar29) {
        if (*puVar25 == *(ulong *)*pauVar36) {
          lVar15 = 0;
          do {
            if (pauVar29 <= (undefined1 (*) [16])(*pauVar36 + lVar15 + 8)) {
              puVar25 = (ulong *)(pBVar34 + lVar15 + uVar16 + 8);
              pauVar39 = (undefined1 (*) [16])(*pauVar36 + lVar15 + 8);
              goto LAB_0015ae56;
            }
            lVar43 = lVar15 + uVar16 + 8;
            uVar42 = *(ulong *)*(undefined1 (*) [16])(*pauVar36 + lVar15 + 8);
            lVar15 = lVar15 + 8;
          } while (*(ulong *)(pBVar34 + lVar43) == uVar42);
          uVar42 = uVar42 ^ *(ulong *)(pBVar34 + lVar43);
          uVar16 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          pZVar37 = (ZSTD_optimal_t *)((uVar16 >> 3 & 0x1fffffff) + lVar15);
        }
        else {
          uVar42 = *(ulong *)*pauVar36 ^ *puVar25;
          uVar16 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          pZVar37 = (ZSTD_optimal_t *)(uVar16 >> 3 & 0x1fffffff);
        }
      }
      else {
LAB_0015ae56:
        if ((pauVar39 < local_198) && ((int)*puVar25 == *(int *)*pauVar39)) {
          pauVar39 = (undefined1 (*) [16])(*pauVar39 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((pauVar39 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar39)) {
          pauVar39 = (undefined1 (*) [16])(*pauVar39 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (pauVar39 < iend) {
          pauVar39 = (undefined1 (*) [16])(*pauVar39 + ((char)*puVar25 == (*pauVar39)[0]));
        }
        pZVar37 = (ZSTD_optimal_t *)((long)pauVar39 - (long)pauVar36);
      }
      if (pZVar37 < (ZSTD_optimal_t *)0x3) goto LAB_00157d8b;
      if (uVar40 <= UVar12) {
LAB_0015b584:
        __assert_fail("current > matchIndex3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4806,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((int)local_250 != 0) {
LAB_0015b5a3:
        __assert_fail("mnum==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4807,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      pZVar2->off = (uVar40 - UVar12) + 2;
      pZVar2->len = (U32)pZVar37;
      if ((pZVar37 <= (ZSTD_optimal_t *)(ulong)uVar31) &&
         (local_250 = 1, pZVar23 = pZVar37,
         (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar36 + -0x10) != iend))
      goto LAB_00157d8b;
      UVar12 = uVar40 + 1;
      local_250 = 1;
    }
    else {
LAB_00157d8b:
      UVar12 = (U32)local_1c0;
      local_1b8->rep[uVar26 - 4] = UVar12;
      if ((uint)local_1b0 <= uVar28) {
        uVar40 = ~(-1 << ((byte)local_1a8 & 0x1f));
        local_1b8 = (ZSTD_optimal_t *)(*pauVar36 + 8);
        pZVar37 = (ZSTD_optimal_t *)0x0;
        pZVar50 = (ZSTD_optimal_t *)0x0;
        uVar31 = uVar30;
        do {
          pZVar51 = pZVar50;
          if (pZVar37 < pZVar50) {
            pZVar51 = pZVar37;
          }
          local_1d0 = pZVar37;
          if ((uint)local_1c0 <= uVar28) {
LAB_0015b2db:
            __assert_fail("current > matchIndex",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4819,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          uVar16 = (long)pZVar51->rep + ((ulong)uVar28 - 0x10);
          if (uVar16 < uVar27) {
LAB_0015b2b9:
            __assert_fail("matchIndex+matchLength >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x481c,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          pBVar48 = pBVar34 + uVar28;
          if (uVar27 <= uVar28) {
            auVar56 = ZEXT1664(auVar56._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            iVar20 = bcmp(pBVar48,pauVar36,(size_t)pZVar51);
            uVar31 = uVar30;
            if (iVar20 != 0) {
LAB_0015b33e:
              __assert_fail("memcmp(match, ip, matchLength) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x481e,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
          }
          pauVar39 = (undefined1 (*) [16])((long)pZVar51->rep + (long)*pauVar36 + -0x10);
          puVar25 = (ulong *)(pBVar48 + (long)pZVar51);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])
                           ((long)pZVar51->rep + (long)local_1b8->rep + lVar15 + -0x20);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)(pBVar34 + uVar16 + lVar15 + 8);
                  goto LAB_00158463;
                }
                lVar43 = lVar15 + uVar16 + 8;
                lVar15 = lVar15 + 8;
              } while (*(ulong *)(pBVar34 + lVar43) == *(ulong *)*pauVar17);
              uVar26 = *(ulong *)*pauVar17 ^ *(ulong *)(pBVar34 + lVar43);
              uVar16 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
            }
            else {
              uVar26 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar16 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = uVar16 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00158463:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            uVar16 = (long)pauVar17 - (long)pauVar39;
          }
          pUVar33 = pZVar51->rep;
          pZVar51 = (ZSTD_optimal_t *)((long)pUVar33 + (uVar16 - 0x10));
          if (pZVar23 < pZVar51) {
            uVar32 = uVar30 - uVar28;
            if (uVar30 < uVar28 || uVar32 == 0) {
LAB_0015b35d:
              __assert_fail("matchEndIdx > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x482b,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            uVar30 = uVar31;
            if ((ZSTD_optimal_t *)(ulong)uVar32 < pZVar51) {
              uVar30 = uVar28 + (U32)pZVar51;
            }
            pZVar2[local_250].off = (UVar12 + 2) - uVar28;
            pZVar2[local_250].len = (U32)pZVar51;
            local_250 = (ulong)((int)local_250 + 1);
            if (((ZSTD_optimal_t *)0x1000 < pZVar51) ||
               (pZVar23 = pZVar51, uVar31 = uVar30,
               (undefined1 (*) [16])(pauVar36[-1] + (long)pUVar33 + uVar16) == iend)) break;
          }
          puVar18 = local_170 + (uVar28 & uVar46) * 2;
          if (pBVar48[(long)pZVar51] < (byte)pauVar36[-1][(long)pUVar33 + uVar16]) {
            *local_188 = uVar28;
            if (uVar28 <= uVar24) {
              local_188 = &local_1d4;
              break;
            }
            puVar18 = puVar18 + 1;
            pZVar37 = pZVar51;
            pZVar51 = pZVar50;
            local_188 = puVar18;
          }
          else {
            *puVar19 = uVar28;
            puVar19 = puVar18;
            pZVar37 = local_1d0;
            if (uVar28 <= uVar24) {
              puVar19 = &local_1d4;
              break;
            }
          }
          bVar52 = uVar40 == 0;
          uVar40 = uVar40 - 1;
          if (bVar52) break;
          uVar28 = *puVar18;
          pZVar50 = pZVar51;
        } while ((uint)local_1b0 <= uVar28);
      }
      *puVar19 = 0;
      *local_188 = 0;
      if (uVar30 <= (uint)local_1c8) goto LAB_0015b442;
      UVar12 = uVar30 - 8;
    }
    ms->nextToUpdate = UVar12;
    goto LAB_001585e2;
  }
  goto LAB_00158669;
LAB_001585a1:
  puVar19 = &local_1d4;
  goto LAB_001585bb;
LAB_001585ab:
  local_200 = &local_1d4;
LAB_001585bb:
  *puVar19 = 0;
  *local_200 = 0;
  if (uVar47 <= (uint)local_1b8) {
LAB_0015b442:
    __assert_fail("matchEndIdx > current+8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4873,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  ms->nextToUpdate = uVar47 - 8;
LAB_001585e2:
  poVar35 = local_128;
  seqStore = local_118;
  if ((int)local_250 == 0) {
LAB_00158669:
    pauVar36 = (undefined1 (*) [16])(*pauVar36 + 1);
    goto LAB_0015ada0;
  }
  local_c0[2] = local_140[2];
  *(undefined8 *)local_c0 = local_140._0_8_;
  pZVar3->mlen = 0;
  pZVar3->litlen = (U32)local_190;
  auVar56 = ZEXT1664(auVar56._0_16_);
  auVar61 = ZEXT1664(in_ZMM5._0_16_);
  UVar12 = ZSTD_litLengthPrice((U32)local_190,local_128,2);
  pZVar3->price = UVar12;
  uVar24 = (int)local_250 - 1;
  uVar31 = pZVar2[uVar24].len;
  if (local_10c < uVar31) {
    UVar11 = pZVar2[uVar24].off;
LAB_0015a9ee:
    uVar16 = 0;
  }
  else {
    UVar11 = ZSTD_litLengthPrice(0,poVar35,2);
    uVar16 = 0;
    pZVar23 = local_c8;
    do {
      auVar64._8_8_ = uVar16;
      auVar64._0_8_ = uVar16;
      auVar64._16_8_ = uVar16;
      auVar64._24_8_ = uVar16;
      auVar54 = vpor_avx2(auVar64,_DAT_0019e020);
      auVar60._8_8_ = uStack_d0;
      auVar60._0_8_ = local_d8;
      auVar60 = vpcmpgtq_avx(auVar54._0_16_ ^ auVar60,auVar60 ^ local_98._0_16_);
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      auVar60 = vpackssdw_avx(auVar60 ^ _DAT_001a1350,auVar60 ^ _DAT_001a1350);
      if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-7].price = 0x40000000;
      }
      auVar8._8_8_ = uStack_d0;
      auVar8._0_8_ = local_d8;
      auVar53 = auVar54._0_16_ ^ auVar8;
      auVar60 = vpcmpgtq_avx(auVar53,auVar8 ^ local_98._0_16_);
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      auVar53 = vpcmpeqd_avx(auVar53,auVar53);
      auVar60 = vpackssdw_avx(auVar60 ^ auVar53,auVar60 ^ auVar53);
      if ((auVar60 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-6].price = 0x40000000;
      }
      auVar57 = vpcmpgtq_avx2(auVar54 ^ local_58,local_78);
      auVar54 = vpackssdw_avx2(auVar57,auVar64);
      auVar60 = auVar54._16_16_ ^ auVar53;
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-5].price = 0x40000000;
      }
      auVar54 = vpackssdw_avx2(auVar57,auVar64);
      auVar60 = auVar54._16_16_ ^ auVar53;
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      if ((auVar60 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-4].price = 0x40000000;
      }
      auVar54 = vpor_avx2(auVar64,_DAT_0019ef40);
      auVar9._8_8_ = uStack_d0;
      auVar9._0_8_ = local_d8;
      auVar60 = vpcmpgtq_avx(auVar54._0_16_ ^ auVar9,auVar9 ^ local_98._0_16_);
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      auVar60 = vpackssdw_avx(auVar60 ^ auVar53,auVar60 ^ auVar53);
      if ((auVar60 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-3].price = 0x40000000;
      }
      auVar10._8_8_ = uStack_d0;
      auVar10._0_8_ = local_d8;
      auVar60 = vpcmpgtq_avx(auVar54._0_16_ ^ auVar10,auVar10 ^ local_98._0_16_);
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      auVar60 = vpackssdw_avx(auVar60 ^ auVar53,auVar60 ^ auVar53);
      if ((auVar60 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-2].price = 0x40000000;
      }
      auVar64 = vpcmpgtq_avx2(auVar54 ^ local_58,local_78);
      auVar54 = vpackssdw_avx2(auVar64,auVar64);
      auVar60 = auVar54._16_16_ ^ auVar53;
      auVar60 = vpackssdw_avx(auVar60,auVar60);
      auVar56 = ZEXT1664(auVar60);
      if ((auVar60 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23[-1].price = 0x40000000;
      }
      auVar54 = vpshufhw_avx2(auVar64,0x84);
      auVar53 = auVar54._16_16_ ^ auVar53;
      auVar60 = vpackssdw_avx(auVar53,auVar53);
      if ((auVar60 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pZVar23->price = 0x40000000;
      }
      uVar16 = uVar16 + 8;
      pZVar23 = pZVar23 + 8;
    } while (local_a8 != uVar16);
    uVar26 = 0;
    uVar16 = local_f0;
    do {
      uVar31 = pZVar2[uVar26].len;
      if ((uint)uVar16 <= uVar31) {
        UVar13 = pZVar2[uVar26].off;
        if (UVar13 == 0xffffffff) {
LAB_0015b193:
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x12c2,"U32 ZSTD_highbit32(U32)");
        }
        uVar24 = 0x1f;
        if (UVar13 + 1 != 0) {
          for (; UVar13 + 1 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar40 = (uint)uVar16 * 0x100 - 0x200;
        do {
          uVar46 = (uint)uVar16;
          if (uVar46 < 3) {
LAB_0015b1b5:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x469f,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          if ((ms->opt).priceType == zop_predef) {
            uVar27 = 0x1f;
            if (uVar46 - 2 != 0) {
              for (; uVar46 - 2 >> uVar27 == 0; uVar27 = uVar27 - 1) {
              }
            }
            if (0x16 < uVar27) goto LAB_0015b171;
            iVar20 = (uVar27 + uVar24) * 0x100 + (uVar40 >> ((byte)uVar27 & 0x1f)) + 0x1000;
          }
          else {
            uVar27 = (ms->opt).offCodeFreq[uVar24] + 1;
            if (uVar27 == 0) goto LAB_0015b193;
            uVar28 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> uVar28 == 0; uVar28 = uVar28 - 1) {
              }
            }
            if (0x16 < uVar28) {
LAB_0015b171:
              __assert_fail("hb + BITCOST_ACCURACY < 31",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x45cb,"U32 ZSTD_fracWeight(U32)");
            }
            uVar32 = uVar46 - 3;
            if (uVar32 < 0x80) {
              uVar32 = (uint)(byte)ZSTD_MLcode(unsigned_int)::ML_Code[uVar32];
            }
            else {
              uVar30 = 0x1f;
              if (uVar32 != 0) {
                for (; uVar32 >> uVar30 == 0; uVar30 = uVar30 - 1) {
                }
              }
              uVar32 = (uVar30 ^ 0xffffffe0) + 0x44;
            }
            uVar30 = (ms->opt).matchLengthFreq[uVar32] + 1;
            if (uVar30 == 0) goto LAB_0015b193;
            uVar47 = 0x1f;
            if (uVar30 != 0) {
              for (; uVar30 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            if (0x16 < uVar47) goto LAB_0015b171;
            iVar20 = (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice) -
                     ((uVar27 * 0x100 >> ((byte)uVar28 & 0x1f)) +
                     (uVar30 * 0x100 >> ((byte)uVar47 & 0x1f)))) +
                     ((ML_bits[uVar32] + uVar24) - (uVar28 + uVar47)) * 0x100 + 0x33;
          }
          uVar16 = uVar16 & 0xffffffff;
          pZVar3[uVar16].mlen = uVar46;
          pZVar3[uVar16].off = UVar13;
          pZVar3[uVar16].litlen = (U32)local_190;
          pZVar3[uVar16].price = iVar20 + UVar11 + UVar12;
          uVar16 = (ulong)(uVar46 + 1);
          uVar40 = uVar40 + 0x100;
        } while (uVar46 + 1 <= uVar31);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != local_250);
    uVar26 = 0;
    uVar31 = (int)uVar16 - 1;
    if (uVar31 != 0) {
      local_1b0 = (ZSTD_optimal_t *)(*pauVar36 + 0xd);
      local_170 = (U32 *)(*pauVar36 + 9);
      local_188 = (uint *)(*pauVar36 + 0xc);
      uVar16 = 1;
      uVar26 = (ulong)uVar31;
LAB_00158a30:
      poVar35 = local_128;
      if (uVar16 == 0x1000) {
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4928,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      local_1d0 = pZVar3 + uVar16;
      UVar12 = 1;
      if (pZVar3[uVar16 - 1].mlen == 0) {
        UVar12 = local_1d0[-1].litlen + 1;
      }
      pauVar39 = (undefined1 (*) [16])(*pauVar36 + uVar16);
      local_190 = CONCAT44(local_190._4_4_,local_1d0[-1].price);
      auVar56 = ZEXT1664(auVar56._0_16_);
      auVar61 = ZEXT1664(auVar61._0_16_);
      iVar21 = (int)pauVar39;
      local_1c0 = uVar16;
      UVar11 = ZSTD_rawLiteralsCost(pauVar39[-1] + 0xf,(U32)local_128,(optState_t *)0x2,iVar21);
      UVar13 = ZSTD_litLengthPrice(UVar12,poVar35,2);
      iVar20 = UVar13 + UVar11 + (int)local_190;
      UVar11 = ZSTD_litLengthPrice(UVar12 - 1,poVar35,2);
      uVar42 = local_1c0;
      pZVar23 = local_1d0;
      iVar20 = iVar20 - UVar11;
      if (999999999 < iVar20) {
        __assert_fail("price < 1000000000",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4931,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      iVar14 = pZVar3[uVar16].price;
      if (iVar14 < iVar20) {
        uVar31 = local_1d0->mlen;
        if (local_1c0 < uVar31) {
          __assert_fail("cur >= opt[cur].mlen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4947,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        iVar20 = iVar14;
        if (uVar31 == 0) goto LAB_00158b7c;
        rVar65 = ZSTD_updateRep(pZVar3[(int)local_1c0 - uVar31].rep,local_1d0->off,
                                (uint)(local_1d0->litlen == 0));
        *&pZVar23->rep = rVar65.rep;
        uVar31 = 1;
        bVar52 = false;
      }
      else {
        local_1d0->off = 0;
        local_1d0->mlen = 0;
        local_1d0->litlen = UVar12;
        local_1d0->price = iVar20;
LAB_00158b7c:
        local_1d0->rep[2] = local_1d0[-1].rep[2];
        *(undefined8 *)local_1d0->rep = *(undefined8 *)local_1d0[-1].rep;
        bVar52 = true;
        uVar31 = 0;
      }
      if (local_f8 < pauVar39) goto LAB_00159f26;
      if (uVar42 == (uVar26 & 0xffffffff)) goto LAB_0015a990;
      local_190 = 0;
      if (bVar52) {
        local_190 = (ulong)pZVar23->litlen;
      }
      local_b8 = &pZVar23->mlen;
      UVar12 = ZSTD_litLengthPrice(0,local_128,2);
      pBVar34 = (ms->window).base;
      uVar16 = (ulong)ms->nextToUpdate;
      if (pauVar39 < (undefined1 (*) [16])(pBVar34 + uVar16)) goto LAB_00159f26;
      UVar11 = (ms->cParams).minMatch;
      while( true ) {
        uVar24 = (uint)uVar16;
        uVar40 = (uint)((long)pauVar39 - (long)pBVar34);
        if (uVar40 <= uVar24) break;
        UVar13 = ZSTD_insertBt1(ms,pBVar34 + uVar16,(BYTE *)iend,UVar11,0);
        uVar16 = (ulong)(UVar13 + uVar24);
        if (UVar13 + uVar24 <= uVar24) goto LAB_0015b1d7;
      }
      if ((ulong)((long)pauVar39 - (long)pBVar34) >> 0x20 != 0) goto LAB_0015b401;
      if ((ulong)((long)iend - (long)pBVar34) >> 0x20 != 0) goto LAB_0015b3df;
      ms->nextToUpdate = uVar40;
      if (UVar11 - 6 < 2) {
        uVar24 = (ms->cParams).targetLength;
        if (0xffe < uVar24) {
          uVar24 = 0xfff;
        }
        local_160 = (uint *)(ms->window).base;
        uVar40 = iVar21 - (int)local_160;
        uVar16 = (ulong)(*(long *)*pauVar39 * -0x30e4432340650000) >>
                 (-(char)(ms->cParams).hashLog & 0x3fU);
        uVar46 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        local_17c = uVar40 - uVar46;
        local_230 = 0;
        if (uVar40 < uVar46) {
          local_17c = 0;
        }
        uVar27 = (ms->window).lowLimit;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar28 = uVar40 - uVar32;
        if (uVar40 - uVar27 <= uVar32) {
          uVar28 = uVar27;
        }
        local_150 = ms->chainTable;
        uVar32 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar28 = uVar27;
        }
        uVar47 = uVar28 + (uVar28 == 0);
        local_1a8 = (uint *)CONCAT44(local_1a8._4_4_,uVar47);
        local_168 = (BYTE *)CONCAT44(local_168._4_4_,uVar46);
        uVar42 = (ulong)((uVar46 & uVar40) * 2);
        local_1c8 = local_150 + uVar42;
        local_1f0 = local_150 + uVar42 + 1;
        uVar38 = (ulong)uVar31;
        pUVar33 = ms->hashTable;
        uVar27 = pUVar33[uVar16];
        local_178 = uVar40 + 8;
        uVar30 = uVar40 + 9;
        local_1b8 = (ZSTD_optimal_t *)CONCAT44(local_1b8._4_4_,uVar30);
        uVar46 = (ms->cParams).searchLog;
        uVar42 = uVar38 + 3;
        pauVar17 = (undefined1 (*) [16])(*pauVar39 + 4);
        local_240 = local_130;
        do {
          if (uVar38 == 3) {
            UVar11 = local_1d0->rep[0] - 1;
          }
          else {
            UVar11 = local_1d0->rep[uVar38];
          }
          if (uVar40 < uVar32) goto LAB_0015b1f6;
          if (UVar11 - 1 < uVar40 - uVar32) {
            if (*(int *)*pauVar39 == *(int *)((long)pauVar39 - (ulong)UVar11)) {
              lVar15 = -(ulong)UVar11;
              puVar25 = (ulong *)((long)pauVar17 + lVar15);
              pauVar41 = pauVar17;
              if (pauVar17 < pauVar29) {
                if (*puVar25 == *(ulong *)*pauVar17) {
                  lVar43 = 0;
                  do {
                    pauVar41 = (undefined1 (*) [16])((long)local_1b0->rep + lVar43 + -0x10);
                    if (pauVar29 <= pauVar41) {
                      puVar25 = (ulong *)(lVar15 + (long)pauVar41);
                      goto LAB_001592b2;
                    }
                    uVar44 = *(ulong *)((long)local_1b0 + lVar43 + lVar15);
                    lVar43 = lVar43 + 8;
                  } while (uVar44 == *(ulong *)*pauVar41);
                  uVar44 = *(ulong *)*pauVar41 ^ uVar44;
                  uVar45 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar22 = ((uint)(uVar45 >> 3) & 0x1fffffff) + (int)lVar43;
                }
                else {
                  uVar45 = *(ulong *)*pauVar17 ^ *puVar25;
                  uVar44 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar22 = (uint)(uVar44 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_001592b2:
                if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                  puVar25 = (ulong *)((long)puVar25 + 4);
                }
                if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                  puVar25 = (ulong *)((long)puVar25 + 2);
                }
                if (pauVar41 < iend) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
                }
                uVar22 = (int)pauVar41 - (int)pauVar17;
              }
              pZVar23 = (ZSTD_optimal_t *)(ulong)(uVar22 + 4);
            }
            else {
              pZVar23 = (ZSTD_optimal_t *)0x0;
            }
          }
          else {
            if (uVar40 < uVar28) goto LAB_0015b218;
            pZVar23 = (ZSTD_optimal_t *)0x0;
          }
          if (local_240 < pZVar23) {
            pZVar2[local_230].off = (int)uVar38 - uVar31;
            pZVar2[local_230].len = (uint)pZVar23;
            local_230 = (ulong)((int)local_230 + 1);
            if ((uVar24 < (uint)pZVar23) ||
               (local_240 = pZVar23,
               (undefined1 (*) [16])((long)pZVar23->rep + (long)*pauVar39 + -0x10) == iend))
            goto LAB_00159d12;
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < uVar42);
        pUVar33[uVar16] = uVar40;
        if (uVar47 <= uVar27) {
          uVar31 = ~(-1 << ((byte)uVar46 & 0x1f));
          local_174 = uVar40 + 2;
          local_158 = local_160 + 2;
          local_218 = (ZSTD_optimal_t *)0x0;
          local_238 = (ZSTD_optimal_t *)0x0;
          do {
            pZVar23 = local_238;
            if (local_218 < local_238) {
              pZVar23 = local_218;
            }
            if (uVar40 <= uVar27) goto LAB_0015b2db;
            uVar16 = (long)pZVar23->rep + ((ulong)uVar27 - 0x10);
            if (uVar16 < uVar32) goto LAB_0015b2b9;
            pUVar33 = (U32 *)((ulong)uVar27 + (long)local_160);
            if (uVar32 <= uVar27) {
              local_1b8 = (ZSTD_optimal_t *)CONCAT44(local_1b8._4_4_,uVar30);
              local_120 = pUVar33;
              iVar21 = bcmp(pUVar33,pauVar39,(size_t)pZVar23);
              pUVar33 = local_120;
              uVar30 = (uint)local_1b8;
              if (iVar21 != 0) goto LAB_0015b33e;
            }
            pauVar17 = (undefined1 (*) [16])((long)pZVar23->rep + (long)*pauVar39 + -0x10);
            puVar25 = (ulong *)((long)pUVar33 + (long)pZVar23);
            pauVar41 = pauVar17;
            if (pauVar17 < pauVar29) {
              if (*puVar25 == *(ulong *)*pauVar17) {
                lVar15 = 0;
                do {
                  pauVar41 = (undefined1 (*) [16])
                             ((undefined1 *)((long)local_170 + (long)pZVar23) + lVar15);
                  if (pauVar29 <= pauVar41) {
                    puVar25 = (ulong *)((long)local_158 + uVar16 + lVar15);
                    goto LAB_0015a0b6;
                  }
                  uVar42 = *(ulong *)((long)local_158 + lVar15 + uVar16);
                  lVar15 = lVar15 + 8;
                } while (uVar42 == *(ulong *)*pauVar41);
                uVar42 = *(ulong *)*pauVar41 ^ uVar42;
                uVar16 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
              }
              else {
                uVar42 = *(ulong *)*pauVar17 ^ *puVar25;
                uVar16 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = uVar16 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0015a0b6:
              if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (pauVar41 < iend) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
              }
              uVar16 = (long)pauVar41 - (long)pauVar17;
            }
            pUVar4 = pZVar23->rep;
            pZVar23 = (ZSTD_optimal_t *)((long)pUVar4 + (uVar16 - 0x10));
            if (local_240 < pZVar23) {
              if (uVar30 < uVar27 || uVar30 - uVar27 == 0) goto LAB_0015b35d;
              if ((ZSTD_optimal_t *)(ulong)(uVar30 - uVar27) < pZVar23) {
                uVar30 = uVar27 + (U32)pZVar23;
              }
              pZVar2[local_230].off = local_174 - uVar27;
              pZVar2[local_230].len = (U32)pZVar23;
              local_230 = (ulong)((int)local_230 + 1);
              if (((ZSTD_optimal_t *)0x1000 < pZVar23) ||
                 (local_240 = pZVar23,
                 (undefined1 (*) [16])(pauVar39[-1] + (long)pUVar4 + uVar16) == iend)) break;
            }
            puVar19 = local_150 + (uVar27 & (uint)local_168) * 2;
            if (*(byte *)((long)pUVar33 + (long)pZVar23) < (byte)pauVar39[-1][(long)pUVar4 + uVar16]
               ) {
              *local_1c8 = uVar27;
              if (uVar27 <= local_17c) {
                local_1c8 = &local_1d4;
                break;
              }
              puVar19 = puVar19 + 1;
              local_218 = pZVar23;
              local_1c8 = puVar19;
            }
            else {
              *local_1f0 = uVar27;
              local_1f0 = puVar19;
              local_238 = pZVar23;
              if (uVar27 <= local_17c) {
                local_1f0 = &local_1d4;
                break;
              }
            }
            bVar52 = uVar31 == 0;
            uVar31 = uVar31 - 1;
            if (bVar52) break;
            uVar27 = *puVar19;
          } while ((uint)local_1a8 <= uVar27);
        }
        *local_1f0 = 0;
        *local_1c8 = 0;
        if (local_178 < uVar30) {
          ms->nextToUpdate = uVar30 - 8;
          goto LAB_00159d12;
        }
        goto LAB_0015b442;
      }
      if (UVar11 != 5) {
        if (UVar11 != 3) {
          uVar24 = (ms->cParams).targetLength;
          if (0xffe < uVar24) {
            uVar24 = 0xfff;
          }
          local_168 = (ms->window).base;
          uVar40 = iVar21 - (int)local_168;
          uVar46 = (uint)(*(int *)*pauVar39 * -0x61c8864f) >> (-(char)(ms->cParams).hashLog & 0x1fU)
          ;
          local_17c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar21 = uVar40 - local_17c;
          local_230 = 0;
          if (uVar40 < local_17c) {
            iVar21 = 0;
          }
          local_150 = (U32 *)CONCAT44(local_150._4_4_,iVar21);
          uVar27 = (ms->window).lowLimit;
          uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar28 = uVar40 - uVar32;
          if (uVar40 - uVar27 <= uVar32) {
            uVar28 = uVar27;
          }
          local_120 = ms->chainTable;
          uVar32 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            uVar28 = uVar27;
          }
          uVar22 = uVar28 + (uVar28 == 0);
          local_160 = (uint *)CONCAT44(local_160._4_4_,uVar22);
          uVar16 = (ulong)((local_17c & uVar40) * 2);
          local_1a8 = local_120 + uVar16;
          local_258 = local_120 + uVar16 + 1;
          uVar42 = (ulong)uVar31;
          pUVar33 = ms->hashTable;
          uVar47 = pUVar33[uVar46];
          local_178 = uVar40 + 8;
          uVar30 = uVar40 + 9;
          local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,uVar30);
          uVar27 = (ms->cParams).searchLog;
          uVar16 = uVar42 + 3;
          pauVar17 = (undefined1 (*) [16])(*pauVar39 + 4);
          local_240 = local_130;
          do {
            if (uVar42 == 3) {
              UVar11 = local_1d0->rep[0] - 1;
            }
            else {
              UVar11 = local_1d0->rep[uVar42];
            }
            if (uVar40 < uVar32) goto LAB_0015b1f6;
            if (UVar11 - 1 < uVar40 - uVar32) {
              if (*(int *)*pauVar39 == *(int *)((long)pauVar39 - (ulong)UVar11)) {
                lVar15 = -(ulong)UVar11;
                puVar25 = (ulong *)((long)pauVar17 + lVar15);
                pauVar41 = pauVar17;
                if (pauVar17 < pauVar29) {
                  if (*puVar25 == *(ulong *)*pauVar17) {
                    lVar43 = 0;
                    do {
                      pauVar41 = (undefined1 (*) [16])((long)local_1b0->rep + lVar43 + -0x10);
                      if (pauVar29 <= pauVar41) {
                        puVar25 = (ulong *)(lVar15 + (long)pauVar41);
                        goto LAB_00159bf6;
                      }
                      uVar38 = *(ulong *)((long)local_1b0 + lVar43 + lVar15);
                      lVar43 = lVar43 + 8;
                    } while (uVar38 == *(ulong *)*pauVar41);
                    uVar38 = *(ulong *)*pauVar41 ^ uVar38;
                    uVar44 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar49 = ((uint)(uVar44 >> 3) & 0x1fffffff) + (int)lVar43;
                  }
                  else {
                    uVar44 = *(ulong *)*pauVar17 ^ *puVar25;
                    uVar38 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar49 = (uint)(uVar38 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00159bf6:
                  if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                    pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                    pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (pauVar41 < iend) {
                    pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]))
                    ;
                  }
                  uVar49 = (int)pauVar41 - (int)pauVar17;
                }
                pZVar23 = (ZSTD_optimal_t *)(ulong)(uVar49 + 4);
              }
              else {
                pZVar23 = (ZSTD_optimal_t *)0x0;
              }
            }
            else {
              if (uVar40 < uVar28) goto LAB_0015b218;
              pZVar23 = (ZSTD_optimal_t *)0x0;
            }
            if (local_240 < pZVar23) {
              pZVar2[local_230].off = (int)uVar42 - uVar31;
              pZVar2[local_230].len = (uint)pZVar23;
              local_230 = (ulong)((int)local_230 + 1);
              if ((uVar24 < (uint)pZVar23) ||
                 (local_240 = pZVar23,
                 (undefined1 (*) [16])((long)pZVar23->rep + (long)*pauVar39 + -0x10) == iend))
              goto LAB_00159d12;
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 < uVar16);
          pUVar33[uVar46] = uVar40;
          if (uVar47 < uVar22) goto LAB_00159cd1;
          uVar31 = ~(-1 << ((byte)uVar27 & 0x1f));
          local_174 = uVar40 + 2;
          local_158 = (uint *)(local_168 + 8);
          local_1b8 = (ZSTD_optimal_t *)0x0;
          local_218 = (ZSTD_optimal_t *)0x0;
          do {
            pZVar23 = local_218;
            if (local_1b8 < local_218) {
              pZVar23 = local_1b8;
            }
            if (uVar40 <= uVar47) goto LAB_0015b2db;
            uVar16 = (long)pZVar23->rep + ((ulong)uVar47 - 0x10);
            if (uVar16 < uVar32) goto LAB_0015b2b9;
            pBVar34 = local_168 + uVar47;
            if (uVar32 <= uVar47) {
              local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,uVar30);
              iVar21 = bcmp(pBVar34,pauVar39,(size_t)pZVar23);
              uVar30 = (uint)local_1c8;
              if (iVar21 != 0) goto LAB_0015b33e;
            }
            pauVar17 = (undefined1 (*) [16])((long)pZVar23->rep + (long)*pauVar39 + -0x10);
            puVar25 = (ulong *)(pBVar34 + (long)pZVar23);
            pauVar41 = pauVar17;
            if (pauVar17 < pauVar29) {
              if (*puVar25 == *(ulong *)*pauVar17) {
                lVar15 = 0;
                do {
                  pauVar41 = (undefined1 (*) [16])
                             ((undefined1 *)((long)local_170 + (long)pZVar23) + lVar15);
                  if (pauVar29 <= pauVar41) {
                    puVar25 = (ulong *)((long)local_158 + uVar16 + lVar15);
                    goto LAB_0015a39a;
                  }
                  uVar42 = *(ulong *)((long)local_158 + lVar15 + uVar16);
                  lVar15 = lVar15 + 8;
                } while (uVar42 == *(ulong *)*pauVar41);
                uVar42 = *(ulong *)*pauVar41 ^ uVar42;
                uVar16 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
              }
              else {
                uVar42 = *(ulong *)*pauVar17 ^ *puVar25;
                uVar16 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = uVar16 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0015a39a:
              if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (pauVar41 < iend) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
              }
              uVar16 = (long)pauVar41 - (long)pauVar17;
            }
            pUVar33 = pZVar23->rep;
            pZVar23 = (ZSTD_optimal_t *)((long)pUVar33 + (uVar16 - 0x10));
            if (local_240 < pZVar23) {
              if (uVar30 < uVar47 || uVar30 - uVar47 == 0) goto LAB_0015b35d;
              if ((ZSTD_optimal_t *)(ulong)(uVar30 - uVar47) < pZVar23) {
                uVar30 = uVar47 + (U32)pZVar23;
              }
              pZVar2[local_230].off = local_174 - uVar47;
              pZVar2[local_230].len = (U32)pZVar23;
              local_230 = (ulong)((int)local_230 + 1);
              if (((ZSTD_optimal_t *)0x1000 < pZVar23) ||
                 (local_240 = pZVar23,
                 (undefined1 (*) [16])(pauVar39[-1] + (long)pUVar33 + uVar16) == iend)) break;
            }
            puVar19 = local_120 + (uVar47 & local_17c) * 2;
            if (pBVar34[(long)pZVar23] < (byte)pauVar39[-1][(long)pUVar33 + uVar16]) {
              *local_1a8 = uVar47;
              if (uVar47 <= (uint)local_150) goto LAB_0015a555;
              puVar19 = puVar19 + 1;
              local_1b8 = pZVar23;
              local_1a8 = puVar19;
            }
            else {
              *local_258 = uVar47;
              local_258 = puVar19;
              local_218 = pZVar23;
              if (uVar47 <= (uint)local_150) goto LAB_0015a548;
            }
            bVar52 = uVar31 == 0;
            uVar31 = uVar31 - 1;
            if (bVar52) break;
            uVar47 = *puVar19;
          } while ((uint)local_160 <= uVar47);
          goto LAB_00159cdd;
        }
        uVar24 = (ms->cParams).targetLength;
        if (0xffe < uVar24) {
          uVar24 = 0xfff;
        }
        local_168 = (ms->window).base;
        uVar46 = iVar21 - (int)local_168;
        uVar40 = (uint)(*(int *)*pauVar39 * -0x61c8864f) >> (-(char)(ms->cParams).hashLog & 0x1fU);
        local_17c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        iVar21 = uVar46 - local_17c;
        local_230 = 0;
        if (uVar46 < local_17c) {
          iVar21 = 0;
        }
        local_150 = (U32 *)CONCAT44(local_150._4_4_,iVar21);
        uVar27 = (ms->window).lowLimit;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar28 = uVar46 - uVar32;
        if (uVar46 - uVar27 <= uVar32) {
          uVar28 = uVar27;
        }
        local_120 = ms->chainTable;
        uVar32 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar28 = uVar27;
        }
        local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,uVar28 + (uVar28 == 0));
        uVar16 = (ulong)((local_17c & uVar46) * 2);
        local_160 = local_120 + uVar16;
        local_1f0 = local_120 + uVar16 + 1;
        uVar42 = (ulong)uVar31;
        pUVar33 = ms->hashTable;
        uVar27 = pUVar33[uVar40];
        local_178 = uVar46 + 8;
        local_1a8 = (uint *)CONCAT44(local_1a8._4_4_,uVar46 + 9);
        uVar30 = (ms->cParams).searchLog;
        uVar16 = uVar42 + 3;
        pauVar17 = (undefined1 (*) [16])(*pauVar39 + 3);
        pZVar23 = local_130;
        do {
          if (uVar42 == 3) {
            UVar11 = local_1d0->rep[0] - 1;
          }
          else {
            UVar11 = local_1d0->rep[uVar42];
          }
          if (uVar46 < uVar32) goto LAB_0015b1f6;
          if (UVar11 - 1 < uVar46 - uVar32) {
            if (((*(uint *)((long)pauVar39 - (ulong)UVar11) ^ *(uint *)*pauVar39) & 0xffffff) == 0)
            {
              lVar15 = -(ulong)UVar11;
              puVar25 = (ulong *)((long)pauVar17 + lVar15);
              pauVar41 = pauVar17;
              if (pauVar17 < pauVar29) {
                if (*puVar25 == *(ulong *)*pauVar17) {
                  lVar43 = 0;
                  do {
                    pauVar41 = (undefined1 (*) [16])((long)local_188 + lVar43);
                    if (pauVar29 <= pauVar41) {
                      puVar25 = (ulong *)(lVar15 + (long)pauVar41);
                      goto LAB_00158ee0;
                    }
                    uVar38 = *(ulong *)((long)local_188 + lVar43 + lVar15);
                    lVar43 = lVar43 + 8;
                  } while (uVar38 == *(ulong *)*pauVar41);
                  uVar38 = *(ulong *)*pauVar41 ^ uVar38;
                  uVar44 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar47 = ((uint)(uVar44 >> 3) & 0x1fffffff) + (int)lVar43;
                }
                else {
                  uVar44 = *(ulong *)*pauVar17 ^ *puVar25;
                  uVar38 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar47 = (uint)(uVar38 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_00158ee0:
                if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                  puVar25 = (ulong *)((long)puVar25 + 4);
                }
                if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                  puVar25 = (ulong *)((long)puVar25 + 2);
                }
                if (pauVar41 < iend) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
                }
                uVar47 = (int)pauVar41 - (int)pauVar17;
              }
              uVar47 = uVar47 + 3;
            }
            else {
              uVar47 = 0;
            }
          }
          else {
            if (uVar46 < uVar28) goto LAB_0015b218;
            uVar47 = 0;
          }
          pZVar37 = (ZSTD_optimal_t *)(ulong)uVar47;
          if (pZVar23 < pZVar37) {
            pZVar2[local_230].off = (int)uVar42 - uVar31;
            pZVar2[local_230].len = uVar47;
            local_230 = (ulong)((int)local_230 + 1);
            if ((uVar24 < uVar47) ||
               (pZVar23 = pZVar37,
               (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar39 + -0x10) == iend))
            goto LAB_00159d12;
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 < uVar16);
        if (pZVar23 < (ZSTD_optimal_t *)0x3) {
          UVar11 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_108,(BYTE *)pauVar39);
          if ((UVar11 < (uint)local_1c8) || (0x3ffff < uVar46 - UVar11)) goto LAB_0015a583;
          uVar16 = (ulong)UVar11;
          puVar25 = (ulong *)(local_168 + uVar16);
          pauVar17 = pauVar39;
          if (pauVar39 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar39) {
              lVar15 = 0;
              do {
                pauVar17 = (undefined1 (*) [16])((long)local_170 + lVar15);
                if (pauVar29 <= pauVar17) {
                  puVar25 = (ulong *)(local_168 + lVar15 + uVar16 + 8);
                  goto LAB_0015a8da;
                }
                lVar43 = lVar15 + uVar16 + 8;
                lVar15 = lVar15 + 8;
              } while (*(ulong *)(local_168 + lVar43) == *(ulong *)*pauVar17);
              uVar42 = *(ulong *)*pauVar17 ^ *(ulong *)(local_168 + lVar43);
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              pZVar37 = (ZSTD_optimal_t *)((uVar16 >> 3 & 0x1fffffff) + lVar15);
            }
            else {
              uVar42 = *(ulong *)*pauVar39 ^ *puVar25;
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              pZVar37 = (ZSTD_optimal_t *)(uVar16 >> 3 & 0x1fffffff);
            }
          }
          else {
LAB_0015a8da:
            if ((pauVar17 < local_198) && ((int)*puVar25 == *(int *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar17 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar17)) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar17 < iend) {
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + ((char)*puVar25 == (*pauVar17)[0]));
            }
            pZVar37 = (ZSTD_optimal_t *)((long)pauVar17 - (long)pauVar39);
          }
          if (pZVar37 < (ZSTD_optimal_t *)0x3) goto LAB_0015a583;
          if (uVar46 <= UVar11) goto LAB_0015b584;
          if ((int)local_230 != 0) goto LAB_0015b5a3;
          pZVar2->off = (uVar46 - UVar11) + 2;
          pZVar2->len = (U32)pZVar37;
          if ((pZVar37 <= (ZSTD_optimal_t *)(ulong)uVar24) &&
             (local_230 = 1, pZVar23 = pZVar37,
             (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar39 + -0x10) != iend))
          goto LAB_0015a583;
          UVar11 = uVar46 + 1;
          local_230 = 1;
        }
        else {
LAB_0015a583:
          pUVar33[uVar40] = uVar46;
          if ((uint)local_1c8 <= uVar27) {
            uVar31 = ~(-1 << ((byte)uVar30 & 0x1f));
            local_174 = uVar46 + 2;
            local_158 = (uint *)(local_168 + 8);
            local_218 = (ZSTD_optimal_t *)0x0;
            local_238 = (ZSTD_optimal_t *)0x0;
            do {
              pZVar37 = local_238;
              if (local_218 < local_238) {
                pZVar37 = local_218;
              }
              if (uVar46 <= uVar27) goto LAB_0015b2db;
              uVar16 = (long)pZVar37->rep + ((ulong)uVar27 - 0x10);
              if (uVar16 < uVar32) goto LAB_0015b2b9;
              pBVar34 = local_168 + uVar27;
              if ((uVar32 <= uVar27) &&
                 (local_1b8 = pZVar23, iVar21 = bcmp(pBVar34,pauVar39,(size_t)pZVar37),
                 pZVar23 = local_1b8, iVar21 != 0)) goto LAB_0015b33e;
              pauVar17 = (undefined1 (*) [16])((long)pZVar37->rep + (long)*pauVar39 + -0x10);
              puVar25 = (ulong *)(pBVar34 + (long)pZVar37);
              pauVar41 = pauVar17;
              if (pauVar17 < pauVar29) {
                if (*puVar25 == *(ulong *)*pauVar17) {
                  lVar15 = 0;
                  do {
                    pauVar41 = (undefined1 (*) [16])
                               ((undefined1 *)((long)local_170 + (long)pZVar37) + lVar15);
                    local_1b8 = pZVar23;
                    if (pauVar29 <= pauVar41) {
                      puVar25 = (ulong *)((long)local_158 + uVar16 + lVar15);
                      goto LAB_0015a731;
                    }
                    uVar42 = *(ulong *)((long)local_158 + lVar15 + uVar16);
                    lVar15 = lVar15 + 8;
                  } while (uVar42 == *(ulong *)*pauVar41);
                  uVar42 = *(ulong *)*pauVar41 ^ uVar42;
                  uVar16 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
                }
                else {
                  uVar42 = *(ulong *)*pauVar17 ^ *puVar25;
                  uVar16 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0015a731:
                if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                  puVar25 = (ulong *)((long)puVar25 + 4);
                }
                if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                  puVar25 = (ulong *)((long)puVar25 + 2);
                }
                if (pauVar41 < iend) {
                  pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
                }
                uVar16 = (long)pauVar41 - (long)pauVar17;
              }
              pUVar33 = pZVar37->rep;
              pZVar37 = (ZSTD_optimal_t *)((long)pUVar33 + (uVar16 - 0x10));
              if (pZVar23 < pZVar37) {
                if ((uint)local_1a8 < uVar27 || (uint)local_1a8 - uVar27 == 0) goto LAB_0015b35d;
                uVar24 = (uint)local_1a8;
                if ((ZSTD_optimal_t *)(ulong)((uint)local_1a8 - uVar27) < pZVar37) {
                  uVar24 = uVar27 + (U32)pZVar37;
                }
                local_1a8 = (uint *)CONCAT44(local_1a8._4_4_,uVar24);
                pZVar2[local_230].off = local_174 - uVar27;
                pZVar2[local_230].len = (U32)pZVar37;
                local_230 = (ulong)((int)local_230 + 1);
                if (((ZSTD_optimal_t *)0x1000 < pZVar37) ||
                   (pZVar23 = pZVar37,
                   (undefined1 (*) [16])(pauVar39[-1] + (long)pUVar33 + uVar16) == iend)) break;
              }
              puVar19 = local_120 + (uVar27 & local_17c) * 2;
              if (pBVar34[(long)pZVar37] < (byte)pauVar39[-1][(long)pUVar33 + uVar16]) {
                *local_160 = uVar27;
                if (uVar27 <= (uint)local_150) {
                  local_160 = &local_1d4;
                  break;
                }
                puVar19 = puVar19 + 1;
                local_218 = pZVar37;
                local_160 = puVar19;
              }
              else {
                *local_1f0 = uVar27;
                local_1f0 = puVar19;
                local_238 = pZVar37;
                if (uVar27 <= (uint)local_150) {
                  local_1f0 = &local_1d4;
                  break;
                }
              }
              bVar52 = uVar31 == 0;
              uVar31 = uVar31 - 1;
              if (bVar52) break;
              uVar27 = *puVar19;
            } while ((uint)local_1c8 <= uVar27);
          }
          *local_1f0 = 0;
          *local_160 = 0;
          if ((uint)local_1a8 <= local_178) goto LAB_0015b442;
          UVar11 = (uint)local_1a8 - 8;
        }
        ms->nextToUpdate = UVar11;
        goto LAB_00159d12;
      }
      uVar24 = (ms->cParams).targetLength;
      if (0xffe < uVar24) {
        uVar24 = 0xfff;
      }
      local_168 = (ms->window).base;
      uVar40 = iVar21 - (int)local_168;
      uVar16 = (ulong)(*(long *)*pauVar39 * -0x30e4432345000000) >>
               (-(char)(ms->cParams).hashLog & 0x3fU);
      local_17c = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      iVar21 = uVar40 - local_17c;
      local_230 = 0;
      if (uVar40 < local_17c) {
        iVar21 = 0;
      }
      local_150 = (U32 *)CONCAT44(local_150._4_4_,iVar21);
      uVar46 = (ms->window).lowLimit;
      uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar27 = uVar40 - uVar28;
      if (uVar40 - uVar46 <= uVar28) {
        uVar27 = uVar46;
      }
      local_120 = ms->chainTable;
      uVar28 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        uVar27 = uVar46;
      }
      uVar47 = uVar27 + (uVar27 == 0);
      local_160 = (uint *)CONCAT44(local_160._4_4_,uVar47);
      uVar42 = (ulong)((local_17c & uVar40) * 2);
      local_1a8 = local_120 + uVar42;
      local_258 = local_120 + uVar42 + 1;
      uVar38 = (ulong)uVar31;
      pUVar33 = ms->hashTable;
      uVar32 = pUVar33[uVar16];
      local_178 = uVar40 + 8;
      uVar30 = uVar40 + 9;
      local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,uVar30);
      uVar46 = (ms->cParams).searchLog;
      uVar42 = uVar38 + 3;
      pauVar17 = (undefined1 (*) [16])(*pauVar39 + 4);
      local_240 = local_130;
      do {
        if (uVar38 == 3) {
          UVar11 = local_1d0->rep[0] - 1;
        }
        else {
          UVar11 = local_1d0->rep[uVar38];
        }
        if (uVar40 < uVar28) goto LAB_0015b1f6;
        if (UVar11 - 1 < uVar40 - uVar28) {
          if (*(int *)*pauVar39 == *(int *)((long)pauVar39 - (ulong)UVar11)) {
            lVar15 = -(ulong)UVar11;
            puVar25 = (ulong *)((long)pauVar17 + lVar15);
            pauVar41 = pauVar17;
            if (pauVar17 < pauVar29) {
              if (*puVar25 == *(ulong *)*pauVar17) {
                lVar43 = 0;
                do {
                  pauVar41 = (undefined1 (*) [16])((long)local_1b0->rep + lVar43 + -0x10);
                  if (pauVar29 <= pauVar41) {
                    puVar25 = (ulong *)(lVar15 + (long)pauVar41);
                    goto LAB_00159607;
                  }
                  uVar44 = *(ulong *)((long)local_1b0 + lVar43 + lVar15);
                  lVar43 = lVar43 + 8;
                } while (uVar44 == *(ulong *)*pauVar41);
                uVar44 = *(ulong *)*pauVar41 ^ uVar44;
                uVar45 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                uVar22 = ((uint)(uVar45 >> 3) & 0x1fffffff) + (int)lVar43;
              }
              else {
                uVar45 = *(ulong *)*pauVar17 ^ *puVar25;
                uVar44 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                uVar22 = (uint)(uVar44 >> 3) & 0x1fffffff;
              }
            }
            else {
LAB_00159607:
              if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (pauVar41 < iend) {
                pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
              }
              uVar22 = (int)pauVar41 - (int)pauVar17;
            }
            pZVar23 = (ZSTD_optimal_t *)(ulong)(uVar22 + 4);
          }
          else {
            pZVar23 = (ZSTD_optimal_t *)0x0;
          }
        }
        else {
          if (uVar40 < uVar27) goto LAB_0015b218;
          pZVar23 = (ZSTD_optimal_t *)0x0;
        }
        if (local_240 < pZVar23) {
          pZVar2[local_230].off = (int)uVar38 - uVar31;
          pZVar2[local_230].len = (uint)pZVar23;
          local_230 = (ulong)((int)local_230 + 1);
          if ((uVar24 < (uint)pZVar23) ||
             (local_240 = pZVar23,
             (undefined1 (*) [16])((long)pZVar23->rep + (long)*pauVar39 + -0x10) == iend))
          goto LAB_00159d12;
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 < uVar42);
      pUVar33[uVar16] = uVar40;
      if (uVar32 < uVar47) {
LAB_00159cd1:
        uVar30 = (uint)local_1c8;
      }
      else {
        uVar31 = ~(-1 << ((byte)uVar46 & 0x1f));
        local_174 = uVar40 + 2;
        local_158 = (uint *)(local_168 + 8);
        local_1b8 = (ZSTD_optimal_t *)0x0;
        local_218 = (ZSTD_optimal_t *)0x0;
        do {
          pZVar23 = local_218;
          if (local_1b8 < local_218) {
            pZVar23 = local_1b8;
          }
          if (uVar40 <= uVar32) goto LAB_0015b2db;
          uVar16 = (long)pZVar23->rep + ((ulong)uVar32 - 0x10);
          if (uVar16 < uVar28) goto LAB_0015b2b9;
          pBVar34 = local_168 + uVar32;
          if (uVar28 <= uVar32) {
            local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,uVar30);
            iVar21 = bcmp(pBVar34,pauVar39,(size_t)pZVar23);
            uVar30 = (uint)local_1c8;
            if (iVar21 != 0) goto LAB_0015b33e;
          }
          pauVar17 = (undefined1 (*) [16])((long)pZVar23->rep + (long)*pauVar39 + -0x10);
          puVar25 = (ulong *)(pBVar34 + (long)pZVar23);
          pauVar41 = pauVar17;
          if (pauVar17 < pauVar29) {
            if (*puVar25 == *(ulong *)*pauVar17) {
              lVar15 = 0;
              do {
                pauVar41 = (undefined1 (*) [16])
                           ((undefined1 *)((long)local_170 + (long)pZVar23) + lVar15);
                if (pauVar29 <= pauVar41) {
                  puVar25 = (ulong *)((long)local_158 + uVar16 + lVar15);
                  goto LAB_00159855;
                }
                uVar42 = *(ulong *)((long)local_158 + lVar15 + uVar16);
                lVar15 = lVar15 + 8;
              } while (uVar42 == *(ulong *)*pauVar41);
              uVar42 = *(ulong *)*pauVar41 ^ uVar42;
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar15;
            }
            else {
              uVar42 = *(ulong *)*pauVar17 ^ *puVar25;
              uVar16 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = uVar16 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00159855:
            if ((pauVar41 < local_198) && ((int)*puVar25 == *(int *)*pauVar41)) {
              pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((pauVar41 < local_1a0) && ((short)*puVar25 == *(short *)*pauVar41)) {
              pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (pauVar41 < iend) {
              pauVar41 = (undefined1 (*) [16])(*pauVar41 + ((char)*puVar25 == (*pauVar41)[0]));
            }
            uVar16 = (long)pauVar41 - (long)pauVar17;
          }
          pUVar33 = pZVar23->rep;
          pZVar23 = (ZSTD_optimal_t *)((long)pUVar33 + (uVar16 - 0x10));
          if (local_240 < pZVar23) {
            if (uVar30 < uVar32 || uVar30 - uVar32 == 0) goto LAB_0015b35d;
            if ((ZSTD_optimal_t *)(ulong)(uVar30 - uVar32) < pZVar23) {
              uVar30 = uVar32 + (U32)pZVar23;
            }
            pZVar2[local_230].off = local_174 - uVar32;
            pZVar2[local_230].len = (U32)pZVar23;
            local_230 = (ulong)((int)local_230 + 1);
            if (((ZSTD_optimal_t *)0x1000 < pZVar23) ||
               (local_240 = pZVar23,
               (undefined1 (*) [16])(pauVar39[-1] + (long)pUVar33 + uVar16) == iend)) break;
          }
          puVar19 = local_120 + (uVar32 & local_17c) * 2;
          if (pBVar34[(long)pZVar23] < (byte)pauVar39[-1][(long)pUVar33 + uVar16]) {
            *local_1a8 = uVar32;
            if (uVar32 <= (uint)local_150) goto LAB_0015a555;
            puVar19 = puVar19 + 1;
            local_1b8 = pZVar23;
            local_1a8 = puVar19;
          }
          else {
            *local_258 = uVar32;
            local_258 = puVar19;
            local_218 = pZVar23;
            if (uVar32 <= (uint)local_150) goto LAB_0015a548;
          }
          bVar52 = uVar31 == 0;
          uVar31 = uVar31 - 1;
          if (bVar52) break;
          uVar32 = *puVar19;
        } while ((uint)local_160 <= uVar32);
      }
LAB_00159cdd:
      *local_258 = 0;
      *local_1a8 = 0;
      if (uVar30 <= local_178) goto LAB_0015b442;
      ms->nextToUpdate = uVar30 - 8;
LAB_00159d12:
      uVar42 = local_1c0;
      if ((int)local_230 != 0) {
        uVar24 = (int)local_230 - 1;
        uVar31 = pZVar2[uVar24].len;
        iVar21 = (int)local_1c0;
        if ((local_10c < uVar31) || (0xfff < iVar21 + uVar31)) {
          UVar12 = 0;
          if (*local_b8 == 0) {
            UVar12 = local_1d0->litlen;
          }
          UVar11 = pZVar2[uVar24].off;
          uVar24 = iVar21 - UVar12;
          if (0x1000 < iVar21 - UVar12) {
            uVar24 = 0;
          }
          uVar16 = (ulong)uVar24;
          goto LAB_0015a9f0;
        }
        uVar16 = 0;
        do {
          uVar31 = (uint)local_f0;
          if (uVar16 != 0) {
            uVar31 = pZVar2[uVar16 - 1].len + 1;
          }
          uVar38 = (ulong)pZVar2[uVar16].len;
          if (uVar31 <= pZVar2[uVar16].len) {
            UVar11 = pZVar2[uVar16].off;
            if (UVar11 == 0xffffffff) goto LAB_0015b193;
            uVar24 = 0x1f;
            if (UVar11 + 1 != 0) {
              for (; UVar11 + 1 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            do {
              if (uVar38 < 3) goto LAB_0015b1b5;
              UVar13 = (U32)uVar38;
              if ((ms->opt).priceType == zop_predef) {
                uVar46 = UVar13 - 2;
                uVar40 = 0x1f;
                if (uVar46 != 0) {
                  for (; uVar46 >> uVar40 == 0; uVar40 = uVar40 - 1) {
                  }
                }
                if (0x16 < uVar40) goto LAB_0015b171;
                iVar14 = (uVar46 * 0x100 >> ((byte)uVar40 & 0x1f)) + (uVar40 + uVar24) * 0x100 +
                         0x1000;
              }
              else {
                uVar40 = (ms->opt).offCodeFreq[uVar24] + 1;
                if (uVar40 == 0) goto LAB_0015b193;
                uVar46 = 0x1f;
                if (uVar40 != 0) {
                  for (; uVar40 >> uVar46 == 0; uVar46 = uVar46 - 1) {
                  }
                }
                if (0x16 < uVar46) goto LAB_0015b171;
                uVar27 = UVar13 - 3;
                if (uVar27 < 0x80) {
                  uVar27 = (uint)(byte)ZSTD_MLcode(unsigned_int)::ML_Code[uVar27];
                }
                else {
                  uVar28 = 0x1f;
                  if (uVar27 != 0) {
                    for (; uVar27 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                    }
                  }
                  uVar27 = (uVar28 ^ 0xffffffe0) + 0x44;
                }
                uVar28 = (ms->opt).matchLengthFreq[uVar27] + 1;
                if (uVar28 == 0) goto LAB_0015b193;
                uVar32 = 0x1f;
                if (uVar28 != 0) {
                  for (; uVar28 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                  }
                }
                if (0x16 < uVar32) goto LAB_0015b171;
                iVar14 = (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice) -
                         ((uVar40 * 0x100 >> ((byte)uVar46 & 0x1f)) +
                         (uVar28 * 0x100 >> ((byte)uVar32 & 0x1f)))) +
                         ((ML_bits[uVar27] + uVar24) - (uVar46 + uVar32)) * 0x100 + 0x33;
              }
              iVar14 = iVar14 + UVar12 + iVar20;
              uVar44 = (ulong)(UVar13 + iVar21);
              if ((uint)uVar26 < UVar13 + iVar21) {
                uVar26 = uVar26 & 0xffffffff;
                pZVar23 = local_a0 + uVar26;
                do {
                  uVar26 = uVar26 + 1;
                  pZVar23->price = 0x40000000;
                  pZVar23 = pZVar23 + 1;
                } while (uVar26 < uVar44);
LAB_00159ed8:
                pZVar3[uVar44].mlen = UVar13;
                pZVar3[uVar44].off = UVar11;
                pZVar3[uVar44].litlen = (U32)local_190;
                pZVar3[uVar44].price = iVar14;
              }
              else if (iVar14 < pZVar3[uVar44].price) goto LAB_00159ed8;
              uVar38 = uVar38 - 1;
            } while (uVar31 <= (uint)uVar38);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_230);
      }
LAB_00159f26:
      uVar16 = uVar42 + 1;
      local_1b0 = (ZSTD_optimal_t *)((long)&local_1b0->price + 1);
      local_170 = (U32 *)((long)local_170 + 1);
      local_188 = (uint *)((long)local_188 + 1);
      if ((uVar26 & 0xffffffff) <= uVar42) goto LAB_0015a990;
      goto LAB_00158a30;
    }
LAB_0015a990:
    uVar16 = uVar26 & 0xffffffff;
    local_104 = pZVar3[uVar16].price;
    UVar11 = pZVar3[uVar16].off;
    uVar31 = pZVar3[uVar16].mlen;
    local_190 = (ulong)pZVar3[uVar16].litlen;
    local_e0 = pZVar3[uVar16].rep[2];
    local_e8 = *(undefined8 *)pZVar3[uVar16].rep;
    uVar24 = pZVar3[uVar16].litlen + uVar31;
    uVar40 = (uint)uVar26 - uVar24;
    uVar16 = (ulong)uVar40;
    if ((uint)uVar26 < uVar24 || uVar40 == 0) goto LAB_0015a9ee;
    if (0xfff < uVar40) {
      __assert_fail("cur < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4995,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
  }
LAB_0015a9f0:
  if (pZVar3->mlen != 0) {
    __assert_fail("opt[0].mlen == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4998,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  iVar20 = (int)uVar16;
  if (uVar31 == 0) {
    local_140 = *&pZVar3[uVar16].rep;
  }
  else {
    auVar56 = ZEXT1664(auVar56._0_16_);
    auVar61 = ZEXT1664(auVar61._0_16_);
    local_140 = (U32  [3])ZSTD_updateRep(pZVar3[uVar16].rep,UVar11,(uint)((int)local_190 == 0));
  }
  auVar60 = auVar61._0_16_;
  uVar24 = iVar20 + 1;
  if (0xfff < uVar24) {
    __assert_fail("storeEnd < ZSTD_OPT_NUM",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x49ab,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  uVar42 = (ulong)uVar24;
  pZVar3[uVar42].price = local_104;
  pZVar3[uVar42].off = UVar11;
  pZVar3[uVar42].mlen = uVar31;
  pZVar3[uVar42].litlen = (U32)local_190;
  *(undefined8 *)pZVar3[uVar42].rep = local_e8;
  pZVar3[uVar42].rep[2] = local_e0;
  uVar26 = uVar16;
  poVar35 = local_128;
  seqStore = local_118;
  if (iVar20 == 0) {
    uVar31 = 1;
LAB_0015ab35:
    uVar16 = (ulong)uVar31;
    do {
      uVar31 = pZVar3[uVar16].litlen;
      uVar26 = (ulong)uVar31;
      UVar12 = pZVar3[uVar16].mlen;
      if (UVar12 == 0) {
        if (uVar16 != uVar42) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x49c4,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        pauVar36 = (undefined1 (*) [16])(*local_148 + uVar26);
      }
      else {
        pauVar36 = (undefined1 (*) [16])(*local_148 + uVar26);
        if (iend < pauVar36) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x49c9,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_190 = CONCAT44(local_190._4_4_,pZVar3[uVar16].off);
        auVar56 = ZEXT1664(auVar56._0_16_);
        auVar61 = ZEXT1664(auVar61._0_16_);
        ZSTD_updateStats(poVar35,uVar31,(BYTE *)local_148,pZVar3[uVar16].off,UVar12);
        if (local_118->maxNbSeq <=
            (ulong)((long)local_118->sequences - (long)local_118->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_118->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        pauVar39 = (undefined1 (*) [16])local_118->lit;
        if (local_118->litStart + local_118->maxNbLit < *pauVar39 + uVar26) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b0 < pauVar36) {
          ZSTD_safecopyLiterals
                    ((BYTE *)pauVar39,(BYTE *)local_148,(BYTE *)pauVar36,(BYTE *)local_b0);
LAB_0015ac05:
          local_118->lit = local_118->lit + uVar26;
          if (0xffff < uVar31) {
            if (local_118->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_118->longLengthID = 1;
            local_118->longLengthPos =
                 (U32)((ulong)((long)local_118->sequences - (long)local_118->sequencesStart) >> 3);
          }
        }
        else {
          *pauVar39 = *local_148;
          if (0x10 < uVar31) {
            pBVar34 = local_118->lit;
            lVar15 = (long)(pBVar34 + 0x10) - (long)(local_148 + 1);
            if (lVar15 < 8) {
              if (-0x10 < lVar15) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar15 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            *(undefined1 (*) [16])(pBVar34 + 0x10) = local_148[1];
            if (uVar26 - 0x21 < 0xffffffffffffffef) {
              lVar15 = 0;
              do {
                uVar7 = *(undefined8 *)((long)(local_148[2] + lVar15) + 8);
                pBVar48 = pBVar34 + lVar15 + 0x20;
                *(undefined8 *)pBVar48 = *(undefined8 *)(local_148[2] + lVar15);
                *(undefined8 *)(pBVar48 + 8) = uVar7;
                *(undefined1 (*) [16])(pBVar48 + 0x10) =
                     *(undefined1 (*) [16])(local_148[3] + lVar15);
                lVar15 = lVar15 + 0x20;
              } while (pBVar48 + 0x20 < pBVar34 + uVar26);
              goto LAB_0015ac05;
            }
          }
          local_118->lit = local_118->lit + uVar26;
        }
        psVar5 = local_118->sequences;
        psVar5->litLength = (U16)uVar31;
        psVar5->offset = (int)local_190 + 1;
        if (0xffff < UVar12 - 3) {
          if (local_118->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_118->longLengthID = 2;
          local_118->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)local_118->sequencesStart) >> 3);
        }
        psVar5->matchLength = (U16)(UVar12 - 3);
        local_118->sequences = psVar5 + 1;
        pauVar36 = (undefined1 (*) [16])(*local_148 + (UVar12 + uVar31));
        poVar35 = local_128;
        seqStore = local_118;
        local_148 = pauVar36;
      }
      auVar60 = auVar61._0_16_;
      auVar53 = auVar56._0_16_;
      uVar16 = uVar16 + 1;
    } while (iVar20 + 2 != (int)uVar16);
  }
  else {
    do {
      uVar40 = (uint)uVar26;
      uVar46 = pZVar3[uVar26].litlen + pZVar3[uVar26].mlen;
      uVar31 = (uint)uVar16;
      pZVar23 = pZVar3 + uVar26;
      iVar21 = pZVar23->price;
      UVar12 = pZVar23->off;
      UVar11 = pZVar23->mlen;
      UVar13 = pZVar23->litlen;
      pZVar23 = pZVar3 + uVar26;
      auVar53._0_4_ = pZVar23->litlen;
      auVar53._4_4_ = pZVar23->rep[0];
      auVar53._8_4_ = pZVar23->rep[1];
      auVar53._12_4_ = pZVar23->rep[2];
      auVar56 = ZEXT1664(auVar53);
      pZVar23 = pZVar3 + uVar16;
      pZVar23->litlen = auVar53._0_4_;
      pZVar23->rep[0] = auVar53._4_4_;
      pZVar23->rep[1] = auVar53._8_4_;
      pZVar23->rep[2] = auVar53._12_4_;
      pZVar23 = pZVar3 + uVar16;
      pZVar23->price = iVar21;
      pZVar23->off = UVar12;
      pZVar23->mlen = UVar11;
      pZVar23->litlen = UVar13;
      uVar16 = (ulong)(uVar31 - 1);
      uVar26 = (ulong)(uVar40 - uVar46);
      if (uVar46 > uVar40) {
        uVar26 = 0;
      }
    } while (uVar46 <= uVar40 && uVar40 - uVar46 != 0);
    if (uVar31 <= uVar24) goto LAB_0015ab35;
  }
  auVar56 = ZEXT1664(auVar53);
  in_ZMM5 = ZEXT1664(auVar60);
  ZSTD_setBasePrices(poVar35,2);
LAB_0015ada0:
  auVar54 = auVar56._0_32_;
  auVar64 = in_ZMM5._0_32_;
  if (local_f8 <= pauVar36) goto LAB_0015af12;
  goto LAB_00156dd4;
LAB_0015a548:
  local_258 = &local_1d4;
  goto LAB_00159cdd;
LAB_0015a555:
  local_1a8 = &local_1d4;
  goto LAB_00159cdd;
}

Assistant:

static void
ZSTD_initStats_ultra(ZSTD_matchState_t* ms,
                     seqStore_t* seqStore,
                     U32 rep[ZSTD_REP_NUM],
               const void* src, size_t srcSize)
{
    U32 tmpRep[ZSTD_REP_NUM];  /* updated rep codes will sink here */
    memcpy(tmpRep, rep, sizeof(tmpRep));

    DEBUGLOG(4, "ZSTD_initStats_ultra (srcSize=%zu)", srcSize);
    assert(ms->opt.litLengthSum == 0);    /* first block */
    assert(seqStore->sequences == seqStore->sequencesStart);   /* no ldm */
    assert(ms->window.dictLimit == ms->window.lowLimit);   /* no dictionary */
    assert(ms->window.dictLimit - ms->nextToUpdate <= 1);  /* no prefix (note: intentional overflow, defined as 2-complement) */

    ZSTD_compressBlock_opt_generic(ms, seqStore, tmpRep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);   /* generate stats into ms->opt*/

    /* invalidate first scan from history */
    ZSTD_resetSeqStore(seqStore);
    ms->window.base -= srcSize;
    ms->window.dictLimit += (U32)srcSize;
    ms->window.lowLimit = ms->window.dictLimit;
    ms->nextToUpdate = ms->window.dictLimit;

    /* re-inforce weight of collected statistics */
    ZSTD_upscaleStats(&ms->opt);
}